

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  Primitive PVar5;
  uint uVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  uint uVar71;
  ulong uVar72;
  byte bVar73;
  ulong uVar74;
  int iVar75;
  ulong uVar76;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar77;
  long lVar78;
  byte bVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  uint uVar82;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar92 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  uint uVar147;
  float pp;
  float fVar148;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar149;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar229 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar162;
  undefined4 uVar163;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar171 [32];
  undefined1 auVar164 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [28];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_930;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 (*local_828) [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  Primitive *local_6f0;
  ulong local_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  RTCHitN local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar5 = prim[1];
  uVar72 = (ulong)(byte)PVar5;
  fVar209 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar91 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar233 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar208 = fVar209 * auVar233._0_4_;
  fVar148 = fVar209 * auVar91._0_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar19);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar87);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar105 = vpmovsxbd_avx2(auVar83);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar72 + 6);
  auVar97 = vpmovsxbd_avx2(auVar88);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar74 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar74 + uVar72 + 6);
  auVar103 = vpmovsxbd_avx2(auVar84);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar76 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar95 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar95);
  auVar115._4_4_ = fVar148;
  auVar115._0_4_ = fVar148;
  auVar115._8_4_ = fVar148;
  auVar115._12_4_ = fVar148;
  auVar115._16_4_ = fVar148;
  auVar115._20_4_ = fVar148;
  auVar115._24_4_ = fVar148;
  auVar115._28_4_ = fVar148;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar107 = ZEXT1632(CONCAT412(fVar209 * auVar91._12_4_,
                                CONCAT48(fVar209 * auVar91._8_4_,
                                         CONCAT44(fVar209 * auVar91._4_4_,fVar148))));
  auVar106 = vpermps_avx2(auVar117,auVar107);
  auVar94 = vpermps_avx512vl(auVar93,auVar107);
  fVar148 = auVar94._0_4_;
  fVar175 = auVar94._4_4_;
  auVar107._4_4_ = fVar175 * auVar99._4_4_;
  auVar107._0_4_ = fVar148 * auVar99._0_4_;
  fVar177 = auVar94._8_4_;
  auVar107._8_4_ = fVar177 * auVar99._8_4_;
  fVar179 = auVar94._12_4_;
  auVar107._12_4_ = fVar179 * auVar99._12_4_;
  fVar149 = auVar94._16_4_;
  auVar107._16_4_ = fVar149 * auVar99._16_4_;
  fVar181 = auVar94._20_4_;
  auVar107._20_4_ = fVar181 * auVar99._20_4_;
  fVar183 = auVar94._24_4_;
  auVar107._24_4_ = fVar183 * auVar99._24_4_;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar97._4_4_ * fVar175;
  auVar105._0_4_ = auVar97._0_4_ * fVar148;
  auVar105._8_4_ = auVar97._8_4_ * fVar177;
  auVar105._12_4_ = auVar97._12_4_ * fVar179;
  auVar105._16_4_ = auVar97._16_4_ * fVar149;
  auVar105._20_4_ = auVar97._20_4_ * fVar181;
  auVar105._24_4_ = auVar97._24_4_ * fVar183;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar104._4_4_ * fVar175;
  auVar95._0_4_ = auVar104._0_4_ * fVar148;
  auVar95._8_4_ = auVar104._8_4_ * fVar177;
  auVar95._12_4_ = auVar104._12_4_ * fVar179;
  auVar95._16_4_ = auVar104._16_4_ * fVar149;
  auVar95._20_4_ = auVar104._20_4_ * fVar181;
  auVar95._24_4_ = auVar104._24_4_ * fVar183;
  auVar95._28_4_ = auVar94._28_4_;
  auVar85 = vfmadd231ps_fma(auVar107,auVar106,auVar96);
  auVar19 = vfmadd231ps_fma(auVar105,auVar106,auVar101);
  auVar86 = vfmadd231ps_fma(auVar95,auVar103,auVar106);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar115,auVar98);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar115,auVar100);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar102,auVar115);
  auVar116._4_4_ = fVar208;
  auVar116._0_4_ = fVar208;
  auVar116._8_4_ = fVar208;
  auVar116._12_4_ = fVar208;
  auVar116._16_4_ = fVar208;
  auVar116._20_4_ = fVar208;
  auVar116._24_4_ = fVar208;
  auVar116._28_4_ = fVar208;
  auVar95 = ZEXT1632(CONCAT412(fVar209 * auVar233._12_4_,
                               CONCAT48(fVar209 * auVar233._8_4_,
                                        CONCAT44(fVar209 * auVar233._4_4_,fVar208))));
  auVar105 = vpermps_avx2(auVar117,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar209 = auVar95._0_4_;
  fVar148 = auVar95._4_4_;
  auVar106._4_4_ = fVar148 * auVar99._4_4_;
  auVar106._0_4_ = fVar209 * auVar99._0_4_;
  fVar175 = auVar95._8_4_;
  auVar106._8_4_ = fVar175 * auVar99._8_4_;
  fVar177 = auVar95._12_4_;
  auVar106._12_4_ = fVar177 * auVar99._12_4_;
  fVar179 = auVar95._16_4_;
  auVar106._16_4_ = fVar179 * auVar99._16_4_;
  fVar149 = auVar95._20_4_;
  auVar106._20_4_ = fVar149 * auVar99._20_4_;
  fVar181 = auVar95._24_4_;
  auVar106._24_4_ = fVar181 * auVar99._24_4_;
  auVar106._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar148;
  auVar93._0_4_ = auVar97._0_4_ * fVar209;
  auVar93._8_4_ = auVar97._8_4_ * fVar175;
  auVar93._12_4_ = auVar97._12_4_ * fVar177;
  auVar93._16_4_ = auVar97._16_4_ * fVar179;
  auVar93._20_4_ = auVar97._20_4_ * fVar149;
  auVar93._24_4_ = auVar97._24_4_ * fVar181;
  auVar93._28_4_ = auVar99._28_4_;
  auVar97._4_4_ = auVar104._4_4_ * fVar148;
  auVar97._0_4_ = auVar104._0_4_ * fVar209;
  auVar97._8_4_ = auVar104._8_4_ * fVar175;
  auVar97._12_4_ = auVar104._12_4_ * fVar177;
  auVar97._16_4_ = auVar104._16_4_ * fVar179;
  auVar97._20_4_ = auVar104._20_4_ * fVar149;
  auVar97._24_4_ = auVar104._24_4_ * fVar181;
  auVar97._28_4_ = auVar95._28_4_;
  auVar87 = vfmadd231ps_fma(auVar106,auVar105,auVar96);
  auVar83 = vfmadd231ps_fma(auVar93,auVar105,auVar101);
  auVar88 = vfmadd231ps_fma(auVar97,auVar105,auVar103);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar116,auVar98);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar116,auVar100);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar116,auVar102);
  auVar98 = vandps_avx(ZEXT1632(auVar85),auVar112);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar11 = (bool)((byte)uVar74 & 1);
  auVar94._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar85._0_4_;
  bVar11 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar85._4_4_;
  bVar11 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar85._8_4_;
  bVar11 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar85._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar19),auVar112);
  uVar74 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar11 = (bool)((byte)uVar74 & 1);
  auVar108._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._0_4_;
  bVar11 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._4_4_;
  bVar11 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._8_4_;
  bVar11 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar86),auVar112);
  uVar74 = vcmpps_avx512vl(auVar98,auVar114,1);
  bVar11 = (bool)((byte)uVar74 & 1);
  auVar98._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._0_4_;
  bVar11 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._4_4_;
  bVar11 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._8_4_;
  bVar11 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar86._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = 0x3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar113._16_4_ = 0x3f800000;
  auVar113._20_4_ = 0x3f800000;
  auVar113._24_4_ = 0x3f800000;
  auVar113._28_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar94,auVar96,auVar113);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar108);
  auVar19 = vfnmadd213ps_fma(auVar108,auVar96,auVar113);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar86 = vfnmadd213ps_fma(auVar98,auVar96,auVar113);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
  auVar102._4_4_ = auVar85._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar85._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar85._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar85._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar111._0_4_ = auVar85._0_4_ * auVar98._0_4_;
  auVar111._4_4_ = auVar85._4_4_ * auVar98._4_4_;
  auVar111._8_4_ = auVar85._8_4_ * auVar98._8_4_;
  auVar111._12_4_ = auVar85._12_4_ * auVar98._12_4_;
  auVar111._16_4_ = auVar98._16_4_ * 0.0;
  auVar111._20_4_ = auVar98._20_4_ * 0.0;
  auVar111._24_4_ = auVar98._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar72 * -2 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar83));
  auVar103._4_4_ = auVar19._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar19._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar19._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar19._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar83));
  auVar110._0_4_ = auVar19._0_4_ * auVar98._0_4_;
  auVar110._4_4_ = auVar19._4_4_ * auVar98._4_4_;
  auVar110._8_4_ = auVar19._8_4_ * auVar98._8_4_;
  auVar110._12_4_ = auVar19._12_4_ * auVar98._12_4_;
  auVar110._16_4_ = auVar98._16_4_ * 0.0;
  auVar110._20_4_ = auVar98._20_4_ * 0.0;
  auVar110._24_4_ = auVar98._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + uVar72 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar88));
  auVar104._4_4_ = auVar98._4_4_ * auVar86._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar86._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar86._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar86._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar88));
  auVar109._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar111);
  auVar96 = vpminsd_avx2(auVar103,auVar110);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar109);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar99._4_4_ = uVar163;
  auVar99._0_4_ = uVar163;
  auVar99._8_4_ = uVar163;
  auVar99._12_4_ = uVar163;
  auVar99._16_4_ = uVar163;
  auVar99._20_4_ = uVar163;
  auVar99._24_4_ = uVar163;
  auVar99._28_4_ = uVar163;
  auVar96 = vmaxps_avx512vl(auVar96,auVar99);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar111);
  auVar96 = vpmaxsd_avx2(auVar103,auVar110);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar109);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar100._4_4_ = uVar163;
  auVar100._0_4_ = uVar163;
  auVar100._8_4_ = uVar163;
  auVar100._12_4_ = uVar163;
  auVar100._16_4_ = uVar163;
  auVar100._20_4_ = uVar163;
  auVar100._24_4_ = uVar163;
  auVar100._28_4_ = uVar163;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar21 = vpcmpgtd_avx512vl(auVar97,_DAT_01fe9900);
  uVar20 = vcmpps_avx512vl(local_280,auVar98,2);
  if ((byte)((byte)uVar20 & (byte)uVar21) == 0) {
    return;
  }
  local_6e8 = (ulong)(byte)((byte)uVar20 & (byte)uVar21);
  local_828 = (undefined1 (*) [32])&local_340;
  local_4a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6f0 = prim;
LAB_01d4abbf:
  lVar78 = 0;
  for (uVar74 = local_6e8; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    lVar78 = lVar78 + 1;
  }
  uVar77 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar78 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar77].ptr;
  uVar74 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar78 = *(long *)&pGVar8[1].time_range.upper;
  auVar85 = *(undefined1 (*) [16])(lVar78 + (long)p_Var9 * uVar74);
  auVar19 = *(undefined1 (*) [16])(lVar78 + (uVar74 + 1) * (long)p_Var9);
  auVar86 = *(undefined1 (*) [16])(lVar78 + (uVar74 + 2) * (long)p_Var9);
  local_6e8 = local_6e8 - 1 & local_6e8;
  auVar87 = *(undefined1 (*) [16])(lVar78 + (uVar74 + 3) * (long)p_Var9);
  if (local_6e8 != 0) {
    uVar76 = local_6e8 - 1 & local_6e8;
    for (uVar74 = local_6e8; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar88 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  _local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar83 = vunpcklps_avx512vl(local_520._0_16_,local_540._0_16_);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar90 = local_620._0_16_;
  local_7f0 = vinsertps_avx512f(auVar83,auVar90,0x28);
  auVar233._0_4_ = auVar85._0_4_ + auVar19._0_4_ + auVar86._0_4_ + auVar87._0_4_;
  auVar233._4_4_ = auVar85._4_4_ + auVar19._4_4_ + auVar86._4_4_ + auVar87._4_4_;
  auVar233._8_4_ = auVar85._8_4_ + auVar19._8_4_ + auVar86._8_4_ + auVar87._8_4_;
  auVar233._12_4_ = auVar85._12_4_ + auVar19._12_4_ + auVar86._12_4_ + auVar87._12_4_;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar83 = vmulps_avx512vl(auVar233,auVar91);
  auVar83 = vsubps_avx(auVar83,auVar88);
  auVar83 = vdpps_avx(auVar83,local_7f0,0x7f);
  fVar209 = *(float *)(ray + k * 4 + 0x60);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = local_800._0_4_;
  auVar84 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar240);
  auVar89 = vfnmadd213ss_fma(auVar84,local_800,ZEXT416(0x40000000));
  local_260 = auVar83._0_4_ * auVar84._0_4_ * auVar89._0_4_;
  auVar92._4_4_ = local_260;
  auVar92._0_4_ = local_260;
  auVar92._8_4_ = local_260;
  auVar92._12_4_ = local_260;
  fStack_7b0 = local_260;
  _local_7c0 = auVar92;
  fStack_7ac = local_260;
  fStack_7a8 = local_260;
  fStack_7a4 = local_260;
  auVar83 = vfmadd231ps_fma(auVar88,local_7f0,auVar92);
  auVar83 = vblendps_avx(auVar83,ZEXT816(0) << 0x40,8);
  auVar85 = vsubps_avx(auVar85,auVar83);
  auVar86 = vsubps_avx(auVar86,auVar83);
  auVar19 = vsubps_avx(auVar19,auVar83);
  auVar87 = vsubps_avx(auVar87,auVar83);
  uVar163 = auVar85._0_4_;
  auVar250._4_4_ = uVar163;
  auVar250._0_4_ = uVar163;
  auVar250._8_4_ = uVar163;
  auVar250._12_4_ = uVar163;
  auVar250._16_4_ = uVar163;
  auVar250._20_4_ = uVar163;
  auVar250._24_4_ = uVar163;
  auVar250._28_4_ = uVar163;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  local_660 = ZEXT1632(auVar85);
  auVar98 = vpermps_avx2(auVar119,local_660);
  auVar120._8_4_ = 2;
  auVar120._0_8_ = 0x200000002;
  auVar120._12_4_ = 2;
  auVar120._16_4_ = 2;
  auVar120._20_4_ = 2;
  auVar120._24_4_ = 2;
  auVar120._28_4_ = 2;
  local_880 = vpermps_avx2(auVar120,local_660);
  auVar254 = ZEXT3264(local_880);
  auVar121._8_4_ = 3;
  auVar121._0_8_ = 0x300000003;
  auVar121._12_4_ = 3;
  auVar121._16_4_ = 3;
  auVar121._20_4_ = 3;
  auVar121._24_4_ = 3;
  auVar121._28_4_ = 3;
  auVar96 = vpermps_avx512vl(auVar121,local_660);
  uVar163 = auVar19._0_4_;
  local_640._4_4_ = uVar163;
  local_640._0_4_ = uVar163;
  local_640._8_4_ = uVar163;
  local_640._12_4_ = uVar163;
  local_640._16_4_ = uVar163;
  local_640._20_4_ = uVar163;
  local_640._24_4_ = uVar163;
  local_640._28_4_ = uVar163;
  auVar244 = ZEXT3264(local_640);
  local_6a0 = ZEXT1632(auVar19);
  local_7e0 = vpermps_avx2(auVar119,local_6a0);
  auVar232 = ZEXT3264(local_7e0);
  auVar99 = vpermps_avx512vl(auVar120,local_6a0);
  auVar100 = vpermps_avx512vl(auVar121,local_6a0);
  local_8a0 = vbroadcastss_avx512vl(auVar86);
  auVar256 = ZEXT3264(local_8a0);
  local_680 = ZEXT1632(auVar86);
  local_8c0 = vpermps_avx512vl(auVar119,local_680);
  auVar257 = ZEXT3264(local_8c0);
  auVar101 = vpermps_avx512vl(auVar120,local_680);
  local_8e0 = vpermps_avx512vl(auVar121,local_680);
  auVar258 = ZEXT3264(local_8e0);
  auVar97 = vbroadcastss_avx512vl(auVar87);
  _local_6c0 = ZEXT1632(auVar87);
  local_900 = vpermps_avx512vl(auVar119,_local_6c0);
  auVar259 = ZEXT3264(local_900);
  auVar102 = vpermps_avx512vl(auVar120,_local_6c0);
  auVar103 = vpermps_avx512vl(auVar121,_local_6c0);
  auVar85 = vmulss_avx512f(auVar90,auVar90);
  auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),local_540,local_540);
  local_240 = vfmadd231ps_avx512vl(auVar104,_local_520,_local_520);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar118);
  local_740 = ZEXT416((uint)local_260);
  local_260 = fVar209 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_440 = vpbroadcastd_avx512vl();
  iVar75 = 1;
  uVar74 = 0;
  local_460 = vpbroadcastd_avx512vl();
  auVar85 = vsqrtss_avx(local_800,local_800);
  auVar19 = vsqrtss_avx(local_800,local_800);
  local_4b0 = ZEXT816(0x3f80000000000000);
  auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar261 = ZEXT3264(auVar104);
  do {
    auVar86 = vmovshdup_avx(local_4b0);
    auVar86 = vsubps_avx(auVar86,local_4b0);
    fVar148 = auVar86._0_4_;
    fVar149 = fVar148 * 0.04761905;
    auVar222._0_4_ = local_4b0._0_4_;
    auVar222._4_4_ = auVar222._0_4_;
    auVar222._8_4_ = auVar222._0_4_;
    auVar222._12_4_ = auVar222._0_4_;
    auVar222._16_4_ = auVar222._0_4_;
    auVar222._20_4_ = auVar222._0_4_;
    auVar222._24_4_ = auVar222._0_4_;
    auVar222._28_4_ = auVar222._0_4_;
    auVar238._4_4_ = fVar148;
    auVar238._0_4_ = fVar148;
    auVar238._8_4_ = fVar148;
    auVar238._12_4_ = fVar148;
    auVar238._16_4_ = fVar148;
    auVar238._20_4_ = fVar148;
    auVar238._24_4_ = fVar148;
    auVar238._28_4_ = fVar148;
    auVar86 = vfmadd231ps_fma(auVar222,auVar238,_DAT_01faff20);
    auVar260 = auVar261._0_32_;
    auVar104 = vsubps_avx512vl(auVar260,ZEXT1632(auVar86));
    fVar148 = auVar86._0_4_;
    fVar175 = auVar86._4_4_;
    auVar66._4_4_ = auVar244._4_4_ * fVar175;
    auVar66._0_4_ = auVar244._0_4_ * fVar148;
    fVar177 = auVar86._8_4_;
    auVar66._8_4_ = auVar244._8_4_ * fVar177;
    fVar179 = auVar86._12_4_;
    auVar66._12_4_ = auVar244._12_4_ * fVar179;
    auVar66._16_4_ = auVar244._16_4_ * 0.0;
    auVar66._20_4_ = auVar244._20_4_ * 0.0;
    auVar66._24_4_ = auVar244._24_4_ * 0.0;
    auVar66._28_4_ = DAT_01faff20._28_4_;
    auVar106 = ZEXT1632(auVar86);
    auVar128._4_4_ = auVar232._4_4_ * fVar175;
    auVar128._0_4_ = auVar232._0_4_ * fVar148;
    auVar128._8_4_ = auVar232._8_4_ * fVar177;
    auVar128._12_4_ = auVar232._12_4_ * fVar179;
    auVar128._16_4_ = auVar232._16_4_ * 0.0;
    auVar128._20_4_ = auVar232._20_4_ * 0.0;
    auVar128._24_4_ = auVar232._24_4_ * 0.0;
    auVar128._28_4_ = auVar222._0_4_;
    auVar105 = vmulps_avx512vl(auVar99,auVar106);
    auVar95 = vmulps_avx512vl(auVar100,auVar106);
    auVar87 = vfmadd231ps_fma(auVar66,auVar104,auVar250);
    auVar83 = vfmadd231ps_fma(auVar128,auVar104,auVar98);
    auVar88 = vfmadd231ps_fma(auVar105,auVar104,auVar254._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar95,auVar104,auVar96);
    auVar95 = vmulps_avx512vl(auVar256._0_32_,auVar106);
    auVar109 = ZEXT1632(auVar86);
    auVar106 = vmulps_avx512vl(auVar257._0_32_,auVar109);
    auVar107 = vmulps_avx512vl(auVar101,auVar109);
    auVar93 = vmulps_avx512vl(auVar258._0_32_,auVar109);
    auVar89 = vfmadd231ps_fma(auVar95,auVar104,auVar244._0_32_);
    auVar84 = vfmadd231ps_fma(auVar106,auVar104,auVar232._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar99);
    auVar106 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar100);
    auVar107 = vmulps_avx512vl(auVar97,auVar109);
    auVar93 = vmulps_avx512vl(auVar259._0_32_,auVar109);
    auVar94 = vmulps_avx512vl(auVar102,auVar109);
    auVar108 = vmulps_avx512vl(auVar103,auVar109);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar256._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar257._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar104,auVar101);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar258._0_32_);
    auVar129._28_4_ = auVar232._28_4_;
    auVar129._0_28_ =
         ZEXT1628(CONCAT412(fVar179 * auVar89._12_4_,
                            CONCAT48(fVar177 * auVar89._8_4_,
                                     CONCAT44(fVar175 * auVar89._4_4_,fVar148 * auVar89._0_4_))));
    auVar109 = vmulps_avx512vl(auVar109,ZEXT1632(auVar84));
    auVar110 = vmulps_avx512vl(ZEXT1632(auVar86),auVar95);
    auVar111 = vmulps_avx512vl(ZEXT1632(auVar86),auVar106);
    auVar86 = vfmadd231ps_fma(auVar129,auVar104,ZEXT1632(auVar87));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,ZEXT1632(auVar83));
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar88));
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar104,auVar105);
    auVar39._4_4_ = auVar107._4_4_ * fVar175;
    auVar39._0_4_ = auVar107._0_4_ * fVar148;
    auVar39._8_4_ = auVar107._8_4_ * fVar177;
    auVar39._12_4_ = auVar107._12_4_ * fVar179;
    auVar39._16_4_ = auVar107._16_4_ * 0.0;
    auVar39._20_4_ = auVar107._20_4_ * 0.0;
    auVar39._24_4_ = auVar107._24_4_ * 0.0;
    auVar39._28_4_ = auVar105._28_4_;
    auVar40._4_4_ = auVar93._4_4_ * fVar175;
    auVar40._0_4_ = auVar93._0_4_ * fVar148;
    auVar40._8_4_ = auVar93._8_4_ * fVar177;
    auVar40._12_4_ = auVar93._12_4_ * fVar179;
    auVar40._16_4_ = auVar93._16_4_ * 0.0;
    auVar40._20_4_ = auVar93._20_4_ * 0.0;
    auVar40._24_4_ = auVar93._24_4_ * 0.0;
    auVar40._28_4_ = auVar107._28_4_;
    auVar41._4_4_ = auVar94._4_4_ * fVar175;
    auVar41._0_4_ = auVar94._0_4_ * fVar148;
    auVar41._8_4_ = auVar94._8_4_ * fVar177;
    auVar41._12_4_ = auVar94._12_4_ * fVar179;
    auVar41._16_4_ = auVar94._16_4_ * 0.0;
    auVar41._20_4_ = auVar94._20_4_ * 0.0;
    auVar41._24_4_ = auVar94._24_4_ * 0.0;
    auVar41._28_4_ = auVar93._28_4_;
    auVar42._4_4_ = auVar108._4_4_ * fVar175;
    auVar42._0_4_ = auVar108._0_4_ * fVar148;
    auVar42._8_4_ = auVar108._8_4_ * fVar177;
    auVar42._12_4_ = auVar108._12_4_ * fVar179;
    auVar42._16_4_ = auVar108._16_4_ * 0.0;
    auVar42._20_4_ = auVar108._20_4_ * 0.0;
    auVar42._24_4_ = auVar108._24_4_ * 0.0;
    auVar42._28_4_ = auVar94._28_4_;
    auVar87 = vfmadd231ps_fma(auVar39,auVar104,ZEXT1632(auVar89));
    auVar83 = vfmadd231ps_fma(auVar40,auVar104,ZEXT1632(auVar84));
    auVar88 = vfmadd231ps_fma(auVar41,auVar104,auVar95);
    auVar89 = vfmadd231ps_fma(auVar42,auVar104,auVar106);
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar179 * auVar87._12_4_,
                                                 CONCAT48(fVar177 * auVar87._8_4_,
                                                          CONCAT44(fVar175 * auVar87._4_4_,
                                                                   fVar148 * auVar87._0_4_)))),
                              auVar104,ZEXT1632(auVar86));
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar83._12_4_ * fVar179,
                                            CONCAT48(auVar83._8_4_ * fVar177,
                                                     CONCAT44(auVar83._4_4_ * fVar175,
                                                              auVar83._0_4_ * fVar148)))),auVar104,
                         auVar109);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar88._12_4_ * fVar179,
                                            CONCAT48(auVar88._8_4_ * fVar177,
                                                     CONCAT44(auVar88._4_4_ * fVar175,
                                                              auVar88._0_4_ * fVar148)))),auVar104,
                         auVar110);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar89._12_4_ * fVar179,
                                             CONCAT48(auVar89._8_4_ * fVar177,
                                                      CONCAT44(auVar89._4_4_ * fVar175,
                                                               auVar89._0_4_ * fVar148)))),auVar111,
                          auVar104);
    auVar104 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar86));
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar83),auVar109);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar88),auVar110);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar89),auVar111);
    auVar252._0_4_ = fVar149 * auVar104._0_4_ * 3.0;
    auVar252._4_4_ = fVar149 * auVar104._4_4_ * 3.0;
    auVar252._8_4_ = fVar149 * auVar104._8_4_ * 3.0;
    auVar252._12_4_ = fVar149 * auVar104._12_4_ * 3.0;
    auVar252._16_4_ = fVar149 * auVar104._16_4_ * 3.0;
    auVar252._20_4_ = fVar149 * auVar104._20_4_ * 3.0;
    auVar252._24_4_ = fVar149 * auVar104._24_4_ * 3.0;
    auVar252._28_4_ = 0;
    auVar253._0_4_ = fVar149 * auVar95._0_4_ * 3.0;
    auVar253._4_4_ = fVar149 * auVar95._4_4_ * 3.0;
    auVar253._8_4_ = fVar149 * auVar95._8_4_ * 3.0;
    auVar253._12_4_ = fVar149 * auVar95._12_4_ * 3.0;
    auVar253._16_4_ = fVar149 * auVar95._16_4_ * 3.0;
    auVar253._20_4_ = fVar149 * auVar95._20_4_ * 3.0;
    auVar253._24_4_ = fVar149 * auVar95._24_4_ * 3.0;
    auVar253._28_4_ = 0;
    auVar43._4_4_ = fVar149 * auVar106._4_4_ * 3.0;
    auVar43._0_4_ = fVar149 * auVar106._0_4_ * 3.0;
    auVar43._8_4_ = fVar149 * auVar106._8_4_ * 3.0;
    auVar43._12_4_ = fVar149 * auVar106._12_4_ * 3.0;
    auVar43._16_4_ = fVar149 * auVar106._16_4_ * 3.0;
    auVar43._20_4_ = fVar149 * auVar106._20_4_ * 3.0;
    auVar43._24_4_ = fVar149 * auVar106._24_4_ * 3.0;
    auVar43._28_4_ = auVar108._28_4_;
    fVar148 = auVar107._0_4_ * 3.0 * fVar149;
    fVar175 = auVar107._4_4_ * 3.0 * fVar149;
    auVar44._4_4_ = fVar175;
    auVar44._0_4_ = fVar148;
    fVar177 = auVar107._8_4_ * 3.0 * fVar149;
    auVar44._8_4_ = fVar177;
    fVar179 = auVar107._12_4_ * 3.0 * fVar149;
    auVar44._12_4_ = fVar179;
    fVar181 = auVar107._16_4_ * 3.0 * fVar149;
    auVar44._16_4_ = fVar181;
    fVar183 = auVar107._20_4_ * 3.0 * fVar149;
    auVar44._20_4_ = fVar183;
    fVar208 = auVar107._24_4_ * 3.0 * fVar149;
    auVar44._24_4_ = fVar208;
    auVar44._28_4_ = fVar149;
    auVar86 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar108 = vpermt2ps_avx512vl(ZEXT1632(auVar84),_DAT_01feed00,ZEXT1632(auVar86));
    auVar109 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,ZEXT1632(auVar86));
    auVar95 = ZEXT1632(auVar86);
    auVar110 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,auVar95);
    auVar239._0_4_ = auVar105._0_4_ + fVar148;
    auVar239._4_4_ = auVar105._4_4_ + fVar175;
    auVar239._8_4_ = auVar105._8_4_ + fVar177;
    auVar239._12_4_ = auVar105._12_4_ + fVar179;
    auVar239._16_4_ = auVar105._16_4_ + fVar181;
    auVar239._20_4_ = auVar105._20_4_ + fVar183;
    auVar239._24_4_ = auVar105._24_4_ + fVar208;
    auVar239._28_4_ = auVar105._28_4_ + fVar149;
    auVar104 = vmaxps_avx(auVar105,auVar239);
    auVar111 = vminps_avx512vl(auVar105,auVar239);
    auVar112 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar95);
    auVar113 = vpermt2ps_avx512vl(auVar252,_DAT_01feed00,auVar95);
    auVar114 = vpermt2ps_avx512vl(auVar253,_DAT_01feed00,auVar95);
    auVar128 = ZEXT1632(auVar86);
    auVar115 = vpermt2ps_avx512vl(auVar43,_DAT_01feed00,auVar128);
    auVar105 = vpermt2ps_avx512vl(auVar44,_DAT_01feed00,auVar128);
    auVar105 = vsubps_avx(auVar112,auVar105);
    auVar95 = vsubps_avx(auVar108,ZEXT1632(auVar84));
    auVar106 = vsubps_avx(auVar109,auVar93);
    auVar107 = vsubps_avx(auVar110,auVar94);
    auVar116 = vmulps_avx512vl(auVar106,auVar43);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar253,auVar107);
    auVar117 = vmulps_avx512vl(auVar107,auVar252);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar43,auVar95);
    auVar118 = vmulps_avx512vl(auVar95,auVar253);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar252,auVar106);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar117 = vmulps_avx512vl(auVar107,auVar107);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar106,auVar106);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar95,auVar95);
    auVar118 = vrcp14ps_avx512vl(auVar117);
    auVar119 = vfnmadd213ps_avx512vl(auVar118,auVar117,auVar260);
    auVar118 = vfmadd132ps_avx512vl(auVar119,auVar118,auVar118);
    auVar116 = vmulps_avx512vl(auVar116,auVar118);
    auVar119 = vmulps_avx512vl(auVar106,auVar115);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar114,auVar107);
    auVar120 = vmulps_avx512vl(auVar107,auVar113);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar115,auVar95);
    auVar121 = vmulps_avx512vl(auVar95,auVar114);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar113,auVar106);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vmulps_avx512vl(auVar119,auVar118);
    auVar116 = vmaxps_avx512vl(auVar116,auVar118);
    auVar116 = vsqrtps_avx512vl(auVar116);
    auVar118 = vmaxps_avx512vl(auVar105,auVar112);
    auVar104 = vmaxps_avx512vl(auVar104,auVar118);
    auVar118 = vaddps_avx512vl(auVar116,auVar104);
    auVar104 = vminps_avx(auVar105,auVar112);
    auVar104 = vminps_avx512vl(auVar111,auVar104);
    auVar104 = vsubps_avx512vl(auVar104,auVar116);
    auVar122._8_4_ = 0x3f800002;
    auVar122._0_8_ = 0x3f8000023f800002;
    auVar122._12_4_ = 0x3f800002;
    auVar122._16_4_ = 0x3f800002;
    auVar122._20_4_ = 0x3f800002;
    auVar122._24_4_ = 0x3f800002;
    auVar122._28_4_ = 0x3f800002;
    auVar105 = vmulps_avx512vl(auVar118,auVar122);
    auVar123._8_4_ = 0x3f7ffffc;
    auVar123._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar123._12_4_ = 0x3f7ffffc;
    auVar123._16_4_ = 0x3f7ffffc;
    auVar123._20_4_ = 0x3f7ffffc;
    auVar123._24_4_ = 0x3f7ffffc;
    auVar123._28_4_ = 0x3f7ffffc;
    local_860 = vmulps_avx512vl(auVar104,auVar123);
    auVar104 = vmulps_avx512vl(auVar105,auVar105);
    auVar105 = vrsqrt14ps_avx512vl(auVar117);
    auVar229._8_4_ = 0xbf000000;
    auVar229._0_8_ = 0xbf000000bf000000;
    auVar229._12_4_ = 0xbf000000;
    auVar229._16_4_ = 0xbf000000;
    auVar229._20_4_ = 0xbf000000;
    auVar229._24_4_ = 0xbf000000;
    auVar229._28_4_ = 0xbf000000;
    auVar111 = vmulps_avx512vl(auVar117,auVar229);
    fVar148 = auVar105._0_4_;
    fVar175 = auVar105._4_4_;
    fVar177 = auVar105._8_4_;
    fVar179 = auVar105._12_4_;
    fVar149 = auVar105._16_4_;
    fVar181 = auVar105._20_4_;
    fVar183 = auVar105._24_4_;
    auVar45._4_4_ = fVar175 * fVar175 * fVar175 * auVar111._4_4_;
    auVar45._0_4_ = fVar148 * fVar148 * fVar148 * auVar111._0_4_;
    auVar45._8_4_ = fVar177 * fVar177 * fVar177 * auVar111._8_4_;
    auVar45._12_4_ = fVar179 * fVar179 * fVar179 * auVar111._12_4_;
    auVar45._16_4_ = fVar149 * fVar149 * fVar149 * auVar111._16_4_;
    auVar45._20_4_ = fVar181 * fVar181 * fVar181 * auVar111._20_4_;
    auVar45._24_4_ = fVar183 * fVar183 * fVar183 * auVar111._24_4_;
    auVar45._28_4_ = auVar118._28_4_;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar105 = vfmadd231ps_avx512vl(auVar45,auVar105,auVar124);
    auVar111 = vmulps_avx512vl(auVar95,auVar105);
    auVar112 = vmulps_avx512vl(auVar106,auVar105);
    auVar116 = vmulps_avx512vl(auVar107,auVar105);
    auVar229 = ZEXT1632(auVar84);
    auVar117 = vsubps_avx512vl(auVar128,auVar229);
    auVar118 = vsubps_avx512vl(auVar128,auVar93);
    auVar119 = vsubps_avx512vl(auVar128,auVar94);
    auVar120 = vmulps_avx512vl(local_620,auVar119);
    auVar120 = vfmadd231ps_avx512vl(auVar120,local_540,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,_local_520,auVar117);
    auVar121 = vmulps_avx512vl(auVar119,auVar119);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,auVar118);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar117);
    auVar122 = vmulps_avx512vl(local_620,auVar116);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar112,local_540);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar111,_local_520);
    auVar116 = vmulps_avx512vl(auVar119,auVar116);
    auVar112 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar117,auVar111);
    auVar112 = vmulps_avx512vl(auVar122,auVar122);
    auVar116 = vsubps_avx512vl(local_220,auVar112);
    auVar123 = vmulps_avx512vl(auVar122,auVar111);
    auVar120 = vsubps_avx512vl(auVar120,auVar123);
    auVar120 = vaddps_avx512vl(auVar120,auVar120);
    auVar123 = vmulps_avx512vl(auVar111,auVar111);
    local_780 = vsubps_avx512vl(auVar121,auVar123);
    auVar104 = vsubps_avx512vl(local_780,auVar104);
    local_560 = vmulps_avx512vl(auVar120,auVar120);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar116,auVar125);
    auVar121 = vmulps_avx512vl(_local_580,auVar104);
    auVar121 = vsubps_avx512vl(local_560,auVar121);
    uVar76 = vcmpps_avx512vl(auVar121,auVar128,5);
    bVar67 = (byte)uVar76;
    fVar148 = (float)local_7c0._0_4_;
    fVar175 = (float)local_7c0._4_4_;
    fVar177 = fStack_7b8;
    fVar179 = fStack_7b4;
    fVar149 = fStack_7b0;
    fVar181 = fStack_7ac;
    fVar183 = fStack_7a8;
    fVar208 = fStack_7a4;
    if (bVar67 == 0) {
LAB_01d4b81b:
      auVar254 = ZEXT3264(local_880);
      auVar244 = ZEXT3264(local_640);
      auVar232 = ZEXT3264(local_7e0);
      auVar256 = ZEXT3264(local_8a0);
      auVar257 = ZEXT3264(local_8c0);
      auVar258 = ZEXT3264(local_8e0);
      auVar259 = ZEXT3264(local_900);
    }
    else {
      auVar121 = vsqrtps_avx512vl(auVar121);
      auVar123 = vaddps_avx512vl(auVar116,auVar116);
      local_600 = vrcp14ps_avx512vl(auVar123);
      auVar124 = vfnmadd213ps_avx512vl(local_600,auVar123,auVar260);
      auVar124 = vfmadd132ps_avx512vl(auVar124,local_600,local_600);
      auVar260._8_4_ = 0x80000000;
      auVar260._0_8_ = 0x8000000080000000;
      auVar260._12_4_ = 0x80000000;
      auVar260._16_4_ = 0x80000000;
      auVar260._20_4_ = 0x80000000;
      auVar260._24_4_ = 0x80000000;
      auVar260._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar120,auVar260);
      auVar125 = vsubps_avx512vl(local_5a0,auVar121);
      local_7a0 = vmulps_avx512vl(auVar125,auVar124);
      auVar121 = vsubps_avx512vl(auVar121,auVar120);
      local_820 = vmulps_avx512vl(auVar121,auVar124);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124 = vblendmps_avx512vl(auVar121,local_7a0);
      auVar126._0_4_ =
           (uint)(bVar67 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar121._0_4_;
      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar11 * auVar124._4_4_ | (uint)!bVar11 * auVar121._4_4_;
      bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar11 * auVar124._8_4_ | (uint)!bVar11 * auVar121._8_4_;
      bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar11 * auVar124._12_4_ | (uint)!bVar11 * auVar121._12_4_;
      bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar11 * auVar124._16_4_ | (uint)!bVar11 * auVar121._16_4_;
      bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar11 * auVar124._20_4_ | (uint)!bVar11 * auVar121._20_4_;
      bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar11 * auVar124._24_4_ | (uint)!bVar11 * auVar121._24_4_;
      bVar11 = SUB81(uVar76 >> 7,0);
      auVar126._28_4_ = (uint)bVar11 * auVar124._28_4_ | (uint)!bVar11 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar121,local_820);
      auVar127._0_4_ =
           (uint)(bVar67 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar121._0_4_;
      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar11 * auVar124._4_4_ | (uint)!bVar11 * auVar121._4_4_;
      bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar11 * auVar124._8_4_ | (uint)!bVar11 * auVar121._8_4_;
      bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar11 * auVar124._12_4_ | (uint)!bVar11 * auVar121._12_4_;
      bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar11 * auVar124._16_4_ | (uint)!bVar11 * auVar121._16_4_;
      bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar11 * auVar124._20_4_ | (uint)!bVar11 * auVar121._20_4_;
      bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar11 * auVar124._24_4_ | (uint)!bVar11 * auVar121._24_4_;
      bVar11 = SUB81(uVar76 >> 7,0);
      auVar127._28_4_ = (uint)bVar11 * auVar124._28_4_ | (uint)!bVar11 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar121);
      local_5c0 = vmaxps_avx512vl(local_240,auVar121);
      auVar33._8_4_ = 0x36000000;
      auVar33._0_8_ = 0x3600000036000000;
      auVar33._12_4_ = 0x36000000;
      auVar33._16_4_ = 0x36000000;
      auVar33._20_4_ = 0x36000000;
      auVar33._24_4_ = 0x36000000;
      auVar33._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar33);
      vandps_avx512vl(auVar116,auVar121);
      uVar72 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar76 = uVar76 & uVar72;
      bVar69 = (byte)uVar76;
      if (bVar69 != 0) {
        uVar72 = vcmpps_avx512vl(auVar104,_DAT_01faff00,2);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar116 = vblendmps_avx512vl(auVar104,auVar112);
        bVar73 = (byte)uVar72;
        uVar82 = (uint)(bVar73 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar73 & 1) * local_5e0._0_4_;
        bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar71 = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * local_5e0._4_4_;
        bVar11 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar141 = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * local_5e0._8_4_;
        bVar11 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar142 = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * local_5e0._12_4_;
        bVar11 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar143 = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * local_5e0._16_4_;
        bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar144 = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * local_5e0._20_4_;
        bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar145 = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * local_5e0._24_4_;
        bVar11 = SUB81(uVar72 >> 7,0);
        uVar146 = (uint)bVar11 * auVar116._28_4_ | (uint)!bVar11 * local_5e0._28_4_;
        auVar126._0_4_ = (bVar69 & 1) * uVar82 | !(bool)(bVar69 & 1) * auVar126._0_4_;
        bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar126._4_4_ = bVar11 * uVar71 | !bVar11 * auVar126._4_4_;
        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar126._8_4_ = bVar11 * uVar141 | !bVar11 * auVar126._8_4_;
        bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar126._12_4_ = bVar11 * uVar142 | !bVar11 * auVar126._12_4_;
        bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar126._16_4_ = bVar11 * uVar143 | !bVar11 * auVar126._16_4_;
        bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar126._20_4_ = bVar11 * uVar144 | !bVar11 * auVar126._20_4_;
        bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar126._24_4_ = bVar11 * uVar145 | !bVar11 * auVar126._24_4_;
        bVar11 = SUB81(uVar76 >> 7,0);
        auVar126._28_4_ = bVar11 * uVar146 | !bVar11 * auVar126._28_4_;
        auVar104 = vblendmps_avx512vl(auVar112,auVar104);
        bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar18 = SUB81(uVar72 >> 7,0);
        auVar127._0_4_ =
             (uint)(bVar69 & 1) *
             ((uint)(bVar73 & 1) * auVar104._0_4_ | !(bool)(bVar73 & 1) * uVar82) |
             !(bool)(bVar69 & 1) * auVar127._0_4_;
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar127._4_4_ =
             (uint)bVar12 * ((uint)bVar11 * auVar104._4_4_ | !bVar11 * uVar71) |
             !bVar12 * auVar127._4_4_;
        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar127._8_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar104._8_4_ | !bVar13 * uVar141) |
             !bVar11 * auVar127._8_4_;
        bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar127._12_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar104._12_4_ | !bVar14 * uVar142) |
             !bVar11 * auVar127._12_4_;
        bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar127._16_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar104._16_4_ | !bVar15 * uVar143) |
             !bVar11 * auVar127._16_4_;
        bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar127._20_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar104._20_4_ | !bVar16 * uVar144) |
             !bVar11 * auVar127._20_4_;
        bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar127._24_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar104._24_4_ | !bVar17 * uVar145) |
             !bVar11 * auVar127._24_4_;
        bVar11 = SUB81(uVar76 >> 7,0);
        auVar127._28_4_ =
             (uint)bVar11 * ((uint)bVar18 * auVar104._28_4_ | !bVar18 * uVar146) |
             !bVar11 * auVar127._28_4_;
        bVar67 = (~bVar69 | bVar73) & bVar67;
      }
      if ((bVar67 & 0x7f) == 0) {
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar104);
        goto LAB_01d4b81b;
      }
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar115 = vxorps_avx512vl(auVar115,auVar112);
      auVar113 = vxorps_avx512vl(auVar113,auVar112);
      uVar82 = *(uint *)(ray + k * 4 + 0x100);
      auVar114 = vxorps_avx512vl(auVar114,auVar112);
      auVar86 = vsubss_avx512f(ZEXT416(uVar82),ZEXT416((uint)local_740._0_4_));
      auVar104 = vbroadcastss_avx512vl(auVar86);
      auVar116 = vminps_avx512vl(auVar104,auVar127);
      auVar65._4_4_ = fStack_25c;
      auVar65._0_4_ = local_260;
      auVar65._8_4_ = fStack_258;
      auVar65._12_4_ = fStack_254;
      auVar65._16_4_ = fStack_250;
      auVar65._20_4_ = fStack_24c;
      auVar65._24_4_ = fStack_248;
      auVar65._28_4_ = fStack_244;
      auVar104 = vmaxps_avx512vl(auVar65,auVar126);
      auVar119 = vmulps_avx512vl(auVar119,auVar43);
      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar253,auVar119);
      auVar86 = vfmadd213ps_fma(auVar117,auVar252,auVar118);
      auVar117 = vmulps_avx512vl(local_620,auVar43);
      auVar117 = vfmadd231ps_avx512vl(auVar117,local_540,auVar253);
      auVar117 = vfmadd231ps_avx512vl(auVar117,_local_520,auVar252);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar117,auVar118);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar118,auVar119,1);
      auVar121 = vxorps_avx512vl(ZEXT1632(auVar86),auVar112);
      auVar124 = vrcp14ps_avx512vl(auVar117);
      auVar125 = vxorps_avx512vl(auVar117,auVar112);
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar129 = vfnmadd213ps_avx512vl(auVar124,auVar117,auVar128);
      auVar86 = vfmadd132ps_fma(auVar129,auVar124,auVar124);
      fVar162 = auVar86._0_4_ * auVar121._0_4_;
      fVar176 = auVar86._4_4_ * auVar121._4_4_;
      auVar46._4_4_ = fVar176;
      auVar46._0_4_ = fVar162;
      fVar178 = auVar86._8_4_ * auVar121._8_4_;
      auVar46._8_4_ = fVar178;
      fVar180 = auVar86._12_4_ * auVar121._12_4_;
      auVar46._12_4_ = fVar180;
      fVar182 = auVar121._16_4_ * 0.0;
      auVar46._16_4_ = fVar182;
      fVar184 = auVar121._20_4_ * 0.0;
      auVar46._20_4_ = fVar184;
      fVar185 = auVar121._24_4_ * 0.0;
      auVar46._24_4_ = fVar185;
      auVar46._28_4_ = auVar121._28_4_;
      uVar21 = vcmpps_avx512vl(auVar117,auVar125,1);
      bVar69 = (byte)uVar20 | (byte)uVar21;
      auVar248._8_4_ = 0xff800000;
      auVar248._0_8_ = 0xff800000ff800000;
      auVar248._12_4_ = 0xff800000;
      auVar248._16_4_ = 0xff800000;
      auVar248._20_4_ = 0xff800000;
      auVar248._24_4_ = 0xff800000;
      auVar248._28_4_ = 0xff800000;
      auVar129 = vblendmps_avx512vl(auVar46,auVar248);
      auVar130._0_4_ =
           (uint)(bVar69 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar124._0_4_;
      bVar11 = (bool)(bVar69 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar11 * auVar129._4_4_ | (uint)!bVar11 * auVar124._4_4_;
      bVar11 = (bool)(bVar69 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar11 * auVar129._8_4_ | (uint)!bVar11 * auVar124._8_4_;
      bVar11 = (bool)(bVar69 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar11 * auVar129._12_4_ | (uint)!bVar11 * auVar124._12_4_;
      bVar11 = (bool)(bVar69 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar11 * auVar129._16_4_ | (uint)!bVar11 * auVar124._16_4_;
      bVar11 = (bool)(bVar69 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar11 * auVar129._20_4_ | (uint)!bVar11 * auVar124._20_4_;
      bVar11 = (bool)(bVar69 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar11 * auVar129._24_4_ | (uint)!bVar11 * auVar124._24_4_;
      auVar130._28_4_ =
           (uint)(bVar69 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar124._28_4_;
      auVar124 = vmaxps_avx512vl(auVar104,auVar130);
      uVar21 = vcmpps_avx512vl(auVar117,auVar125,6);
      bVar69 = (byte)uVar20 | (byte)uVar21;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131._0_4_ =
           (uint)(bVar69 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)fVar162;
      bVar11 = (bool)(bVar69 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * (int)fVar176;
      bVar11 = (bool)(bVar69 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * (int)fVar178;
      bVar11 = (bool)(bVar69 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * (int)fVar180;
      bVar11 = (bool)(bVar69 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * (int)fVar182;
      bVar11 = (bool)(bVar69 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * (int)fVar184;
      bVar11 = (bool)(bVar69 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar11 * auVar117._24_4_ | (uint)!bVar11 * (int)fVar185;
      auVar131._28_4_ =
           (uint)(bVar69 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar121._28_4_;
      auVar121 = vminps_avx512vl(auVar116,auVar131);
      auVar104 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
      auVar108 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
      auVar125 = ZEXT832(0) << 0x20;
      auVar109 = vsubps_avx(auVar125,auVar110);
      auVar109 = vmulps_avx512vl(auVar109,auVar115);
      auVar108 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar108);
      auVar104 = vfmadd231ps_avx512vl(auVar108,auVar113,auVar104);
      auVar108 = vmulps_avx512vl(local_620,auVar115);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_540,auVar114);
      auVar108 = vfmadd231ps_avx512vl(auVar108,_local_520,auVar113);
      vandps_avx512vl(auVar108,auVar118);
      uVar20 = vcmpps_avx512vl(auVar108,auVar119,1);
      auVar104 = vxorps_avx512vl(auVar104,auVar112);
      auVar109 = vrcp14ps_avx512vl(auVar108);
      auVar110 = vxorps_avx512vl(auVar108,auVar112);
      auVar112 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar128);
      auVar86 = vfmadd132ps_fma(auVar112,auVar109,auVar109);
      fVar162 = auVar86._0_4_ * auVar104._0_4_;
      fVar176 = auVar86._4_4_ * auVar104._4_4_;
      auVar47._4_4_ = fVar176;
      auVar47._0_4_ = fVar162;
      fVar178 = auVar86._8_4_ * auVar104._8_4_;
      auVar47._8_4_ = fVar178;
      fVar180 = auVar86._12_4_ * auVar104._12_4_;
      auVar47._12_4_ = fVar180;
      fVar182 = auVar104._16_4_ * 0.0;
      auVar47._16_4_ = fVar182;
      fVar184 = auVar104._20_4_ * 0.0;
      auVar47._20_4_ = fVar184;
      fVar185 = auVar104._24_4_ * 0.0;
      auVar47._24_4_ = fVar185;
      auVar47._28_4_ = auVar104._28_4_;
      uVar21 = vcmpps_avx512vl(auVar108,auVar110,1);
      bVar69 = (byte)uVar20 | (byte)uVar21;
      auVar112 = vblendmps_avx512vl(auVar47,auVar248);
      auVar132._0_4_ =
           (uint)(bVar69 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar109._0_4_;
      bVar11 = (bool)(bVar69 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar11 * auVar112._4_4_ | (uint)!bVar11 * auVar109._4_4_;
      bVar11 = (bool)(bVar69 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar11 * auVar112._8_4_ | (uint)!bVar11 * auVar109._8_4_;
      bVar11 = (bool)(bVar69 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar11 * auVar112._12_4_ | (uint)!bVar11 * auVar109._12_4_;
      bVar11 = (bool)(bVar69 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar11 * auVar112._16_4_ | (uint)!bVar11 * auVar109._16_4_;
      bVar11 = (bool)(bVar69 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar11 * auVar112._20_4_ | (uint)!bVar11 * auVar109._20_4_;
      bVar11 = (bool)(bVar69 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar11 * auVar112._24_4_ | (uint)!bVar11 * auVar109._24_4_;
      auVar132._28_4_ =
           (uint)(bVar69 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar109._28_4_;
      _local_6e0 = vmaxps_avx(auVar124,auVar132);
      uVar21 = vcmpps_avx512vl(auVar108,auVar110,6);
      bVar69 = (byte)uVar20 | (byte)uVar21;
      auVar133._0_4_ =
           (uint)(bVar69 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)fVar162;
      bVar11 = (bool)(bVar69 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * (int)fVar176;
      bVar11 = (bool)(bVar69 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * (int)fVar178;
      bVar11 = (bool)(bVar69 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * (int)fVar180;
      bVar11 = (bool)(bVar69 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * (int)fVar182;
      bVar11 = (bool)(bVar69 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * (int)fVar184;
      bVar11 = (bool)(bVar69 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar11 * auVar117._24_4_ | (uint)!bVar11 * (int)fVar185;
      auVar133._28_4_ =
           (uint)(bVar69 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar104._28_4_;
      local_2e0 = vminps_avx(auVar121,auVar133);
      uVar20 = vcmpps_avx512vl(_local_6e0,local_2e0,2);
      bVar67 = bVar67 & 0x7f & (byte)uVar20;
      if (bVar67 == 0) {
        auVar261 = ZEXT3264(auVar128);
        goto LAB_01d4b81b;
      }
      auVar104 = vmaxps_avx(auVar125,local_860);
      auVar108 = vfmadd213ps_avx512vl(local_7a0,auVar122,auVar111);
      fVar162 = auVar105._0_4_;
      fVar176 = auVar105._4_4_;
      auVar48._4_4_ = fVar176 * auVar108._4_4_;
      auVar48._0_4_ = fVar162 * auVar108._0_4_;
      fVar178 = auVar105._8_4_;
      auVar48._8_4_ = fVar178 * auVar108._8_4_;
      fVar180 = auVar105._12_4_;
      auVar48._12_4_ = fVar180 * auVar108._12_4_;
      fVar182 = auVar105._16_4_;
      auVar48._16_4_ = fVar182 * auVar108._16_4_;
      fVar184 = auVar105._20_4_;
      auVar48._20_4_ = fVar184 * auVar108._20_4_;
      fVar185 = auVar105._24_4_;
      auVar48._24_4_ = fVar185 * auVar108._24_4_;
      auVar48._28_4_ = auVar108._28_4_;
      auVar108 = vfmadd213ps_avx512vl(local_820,auVar122,auVar111);
      auVar49._4_4_ = fVar176 * auVar108._4_4_;
      auVar49._0_4_ = fVar162 * auVar108._0_4_;
      auVar49._8_4_ = fVar178 * auVar108._8_4_;
      auVar49._12_4_ = fVar180 * auVar108._12_4_;
      auVar49._16_4_ = fVar182 * auVar108._16_4_;
      auVar49._20_4_ = fVar184 * auVar108._20_4_;
      auVar49._24_4_ = fVar185 * auVar108._24_4_;
      auVar49._28_4_ = auVar132._28_4_;
      auVar108 = vminps_avx512vl(auVar48,auVar128);
      auVar58 = ZEXT812(0);
      auVar109 = ZEXT1232(auVar58) << 0x20;
      auVar108 = vmaxps_avx(auVar108,ZEXT1232(auVar58) << 0x20);
      auVar110 = vminps_avx512vl(auVar49,auVar128);
      auVar50._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar108._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar50,auVar238,auVar222);
      auVar108 = vmaxps_avx(auVar110,ZEXT1232(auVar58) << 0x20);
      auVar51._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar108._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar51,auVar238,auVar222);
      auVar52._4_4_ = auVar104._4_4_ * auVar104._4_4_;
      auVar52._0_4_ = auVar104._0_4_ * auVar104._0_4_;
      auVar52._8_4_ = auVar104._8_4_ * auVar104._8_4_;
      auVar52._12_4_ = auVar104._12_4_ * auVar104._12_4_;
      auVar52._16_4_ = auVar104._16_4_ * auVar104._16_4_;
      auVar52._20_4_ = auVar104._20_4_ * auVar104._20_4_;
      auVar52._24_4_ = auVar104._24_4_ * auVar104._24_4_;
      auVar52._28_4_ = auVar104._28_4_;
      auVar108 = vsubps_avx(local_780,auVar52);
      auVar53._4_4_ = auVar108._4_4_ * (float)local_580._4_4_;
      auVar53._0_4_ = auVar108._0_4_ * (float)local_580._0_4_;
      auVar53._8_4_ = auVar108._8_4_ * fStack_578;
      auVar53._12_4_ = auVar108._12_4_ * fStack_574;
      auVar53._16_4_ = auVar108._16_4_ * fStack_570;
      auVar53._20_4_ = auVar108._20_4_ * fStack_56c;
      auVar53._24_4_ = auVar108._24_4_ * fStack_568;
      auVar53._28_4_ = auVar104._28_4_;
      auVar104 = vsubps_avx(local_560,auVar53);
      uVar20 = vcmpps_avx512vl(auVar104,ZEXT1232(auVar58) << 0x20,5);
      bVar69 = (byte)uVar20;
      auVar259 = ZEXT3264(local_900);
      if (bVar69 == 0) {
        bVar69 = 0;
        auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar232 = ZEXT864(0) << 0x20;
        auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar251 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar134._8_4_ = 0x7f800000;
        auVar134._0_8_ = 0x7f8000007f800000;
        auVar134._12_4_ = 0x7f800000;
        auVar134._16_4_ = 0x7f800000;
        auVar134._20_4_ = 0x7f800000;
        auVar134._24_4_ = 0x7f800000;
        auVar134._28_4_ = 0x7f800000;
        auVar135._8_4_ = 0xff800000;
        auVar135._0_8_ = 0xff800000ff800000;
        auVar135._12_4_ = 0xff800000;
        auVar135._16_4_ = 0xff800000;
        auVar135._20_4_ = 0xff800000;
        auVar135._24_4_ = 0xff800000;
        auVar135._28_4_ = 0xff800000;
      }
      else {
        auVar87 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
        uVar76 = vcmpps_avx512vl(auVar104,auVar125,5);
        auVar104 = vsqrtps_avx(auVar104);
        auVar109 = vfnmadd213ps_avx512vl(auVar123,local_600,auVar128);
        auVar112 = vfmadd132ps_avx512vl(auVar109,local_600,local_600);
        auVar109 = vsubps_avx(local_5a0,auVar104);
        auVar113 = vmulps_avx512vl(auVar109,auVar112);
        auVar104 = vsubps_avx512vl(auVar104,auVar120);
        auVar112 = vmulps_avx512vl(auVar104,auVar112);
        auVar104 = vfmadd213ps_avx512vl(auVar122,auVar113,auVar111);
        auVar54._4_4_ = fVar176 * auVar104._4_4_;
        auVar54._0_4_ = fVar162 * auVar104._0_4_;
        auVar54._8_4_ = fVar178 * auVar104._8_4_;
        auVar54._12_4_ = fVar180 * auVar104._12_4_;
        auVar54._16_4_ = fVar182 * auVar104._16_4_;
        auVar54._20_4_ = fVar184 * auVar104._20_4_;
        auVar54._24_4_ = fVar185 * auVar104._24_4_;
        auVar54._28_4_ = auVar110._28_4_;
        auVar55._4_4_ = (float)local_520._4_4_ * auVar113._4_4_;
        auVar55._0_4_ = (float)local_520._0_4_ * auVar113._0_4_;
        auVar55._8_4_ = fStack_518 * auVar113._8_4_;
        auVar55._12_4_ = fStack_514 * auVar113._12_4_;
        auVar55._16_4_ = fStack_510 * auVar113._16_4_;
        auVar55._20_4_ = fStack_50c * auVar113._20_4_;
        auVar55._24_4_ = fStack_508 * auVar113._24_4_;
        auVar55._28_4_ = auVar104._28_4_;
        auVar109 = vmulps_avx512vl(local_540,auVar113);
        auVar114 = vmulps_avx512vl(local_620,auVar113);
        auVar104 = vfmadd213ps_avx512vl(auVar95,auVar54,auVar229);
        auVar104 = vsubps_avx512vl(auVar55,auVar104);
        auVar110 = vfmadd213ps_avx512vl(auVar106,auVar54,auVar93);
        auVar110 = vsubps_avx512vl(auVar109,auVar110);
        auVar86 = vfmadd213ps_fma(auVar54,auVar107,auVar94);
        auVar109 = vsubps_avx(auVar114,ZEXT1632(auVar86));
        auVar251 = auVar109._0_28_;
        auVar109 = vfmadd213ps_avx512vl(auVar122,auVar112,auVar111);
        auVar111 = vmulps_avx512vl(auVar105,auVar109);
        auVar56._4_4_ = (float)local_520._4_4_ * auVar112._4_4_;
        auVar56._0_4_ = (float)local_520._0_4_ * auVar112._0_4_;
        auVar56._8_4_ = fStack_518 * auVar112._8_4_;
        auVar56._12_4_ = fStack_514 * auVar112._12_4_;
        auVar56._16_4_ = fStack_510 * auVar112._16_4_;
        auVar56._20_4_ = fStack_50c * auVar112._20_4_;
        auVar56._24_4_ = fStack_508 * auVar112._24_4_;
        auVar56._28_4_ = auVar114._28_4_;
        auVar105 = vmulps_avx512vl(local_540,auVar112);
        auVar114 = vmulps_avx512vl(local_620,auVar112);
        auVar86 = vfmadd213ps_fma(auVar95,auVar111,auVar229);
        auVar109 = vsubps_avx(auVar56,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar106,auVar111,auVar93);
        auVar105 = vsubps_avx512vl(auVar105,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar107,auVar111,auVar94);
        auVar95 = vsubps_avx512vl(auVar114,ZEXT1632(auVar86));
        auVar232 = ZEXT3264(auVar95);
        auVar202._8_4_ = 0x7f800000;
        auVar202._0_8_ = 0x7f8000007f800000;
        auVar202._12_4_ = 0x7f800000;
        auVar202._16_4_ = 0x7f800000;
        auVar202._20_4_ = 0x7f800000;
        auVar202._24_4_ = 0x7f800000;
        auVar202._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar202,auVar113);
        bVar11 = (bool)((byte)uVar76 & 1);
        auVar134._0_4_ = (uint)bVar11 * auVar95._0_4_ | (uint)!bVar11 * auVar84._0_4_;
        bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar84._4_4_;
        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar84._8_4_;
        bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar84._12_4_;
        iVar1 = (uint)((byte)(uVar76 >> 4) & 1) * auVar95._16_4_;
        auVar134._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar76 >> 5) & 1) * auVar95._20_4_;
        auVar134._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar76 >> 6) & 1) * auVar95._24_4_;
        auVar134._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar76 >> 7) * auVar95._28_4_;
        auVar134._28_4_ = iVar4;
        auVar203._8_4_ = 0xff800000;
        auVar203._0_8_ = 0xff800000ff800000;
        auVar203._12_4_ = 0xff800000;
        auVar203._16_4_ = 0xff800000;
        auVar203._20_4_ = 0xff800000;
        auVar203._24_4_ = 0xff800000;
        auVar203._28_4_ = 0xff800000;
        auVar95 = vblendmps_avx512vl(auVar203,auVar112);
        bVar11 = (bool)((byte)uVar76 & 1);
        auVar135._0_4_ = (uint)bVar11 * auVar95._0_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = SUB81(uVar76 >> 7,0);
        auVar135._28_4_ = (uint)bVar11 * auVar95._28_4_ | (uint)!bVar11 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar95 = vmulps_avx512vl(local_5c0,auVar34);
        uVar72 = vcmpps_avx512vl(auVar95,local_5e0,0xe);
        uVar76 = uVar76 & uVar72;
        bVar73 = (byte)uVar76;
        if (bVar73 != 0) {
          uVar72 = vcmpps_avx512vl(auVar108,ZEXT1632(auVar87),2);
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar106 = vblendmps_avx512vl(auVar247,auVar249);
          bVar79 = (byte)uVar72;
          uVar71 = (uint)(bVar79 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar95._0_4_;
          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
          uVar141 = (uint)bVar11 * auVar106._4_4_ | (uint)!bVar11 * auVar95._4_4_;
          bVar11 = (bool)((byte)(uVar72 >> 2) & 1);
          uVar142 = (uint)bVar11 * auVar106._8_4_ | (uint)!bVar11 * auVar95._8_4_;
          bVar11 = (bool)((byte)(uVar72 >> 3) & 1);
          uVar143 = (uint)bVar11 * auVar106._12_4_ | (uint)!bVar11 * auVar95._12_4_;
          bVar11 = (bool)((byte)(uVar72 >> 4) & 1);
          uVar144 = (uint)bVar11 * auVar106._16_4_ | (uint)!bVar11 * auVar95._16_4_;
          bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
          uVar145 = (uint)bVar11 * auVar106._20_4_ | (uint)!bVar11 * auVar95._20_4_;
          bVar11 = (bool)((byte)(uVar72 >> 6) & 1);
          uVar146 = (uint)bVar11 * auVar106._24_4_ | (uint)!bVar11 * auVar95._24_4_;
          bVar11 = SUB81(uVar72 >> 7,0);
          uVar147 = (uint)bVar11 * auVar106._28_4_ | (uint)!bVar11 * auVar95._28_4_;
          auVar134._0_4_ = (bVar73 & 1) * uVar71 | !(bool)(bVar73 & 1) * auVar134._0_4_;
          bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar134._4_4_ = bVar11 * uVar141 | !bVar11 * auVar134._4_4_;
          bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar134._8_4_ = bVar11 * uVar142 | !bVar11 * auVar134._8_4_;
          bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar134._12_4_ = bVar11 * uVar143 | !bVar11 * auVar134._12_4_;
          bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar134._16_4_ = bVar11 * uVar144 | (uint)!bVar11 * iVar1;
          bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar134._20_4_ = bVar11 * uVar145 | (uint)!bVar11 * iVar2;
          bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar134._24_4_ = bVar11 * uVar146 | (uint)!bVar11 * iVar3;
          bVar11 = SUB81(uVar76 >> 7,0);
          auVar134._28_4_ = bVar11 * uVar147 | (uint)!bVar11 * iVar4;
          auVar95 = vblendmps_avx512vl(auVar249,auVar247);
          bVar11 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar72 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar72 >> 6) & 1);
          bVar18 = SUB81(uVar72 >> 7,0);
          auVar135._0_4_ =
               (uint)(bVar73 & 1) *
               ((uint)(bVar79 & 1) * auVar95._0_4_ | !(bool)(bVar79 & 1) * uVar71) |
               !(bool)(bVar73 & 1) * auVar135._0_4_;
          bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar135._4_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar95._4_4_ | !bVar11 * uVar141) |
               !bVar12 * auVar135._4_4_;
          bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar135._8_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar95._8_4_ | !bVar13 * uVar142) |
               !bVar11 * auVar135._8_4_;
          bVar11 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar135._12_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar95._12_4_ | !bVar14 * uVar143) |
               !bVar11 * auVar135._12_4_;
          bVar11 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar135._16_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar95._16_4_ | !bVar15 * uVar144) |
               !bVar11 * auVar135._16_4_;
          bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar135._20_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar95._20_4_ | !bVar16 * uVar145) |
               !bVar11 * auVar135._20_4_;
          bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar135._24_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar95._24_4_ | !bVar17 * uVar146) |
               !bVar11 * auVar135._24_4_;
          bVar11 = SUB81(uVar76 >> 7,0);
          auVar135._28_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar95._28_4_ | !bVar18 * uVar147) |
               !bVar11 * auVar135._28_4_;
          bVar69 = (~bVar73 | bVar79) & bVar69;
        }
      }
      auVar244._0_4_ = local_620._0_4_ * auVar232._0_4_;
      auVar244._4_4_ = local_620._4_4_ * auVar232._4_4_;
      auVar244._8_4_ = local_620._8_4_ * auVar232._8_4_;
      auVar244._12_4_ = local_620._12_4_ * auVar232._12_4_;
      auVar244._16_4_ = local_620._16_4_ * auVar232._16_4_;
      auVar244._20_4_ = local_620._20_4_ * auVar232._20_4_;
      auVar244._28_36_ = auVar232._28_36_;
      auVar244._24_4_ = local_620._24_4_ * auVar232._24_4_;
      auVar86 = vfmadd231ps_fma(auVar244._0_32_,local_540,auVar105);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),_local_520,auVar109);
      _local_200 = _local_6e0;
      local_1e0 = vminps_avx(local_2e0,auVar134);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar243._16_4_ = 0x7fffffff;
      auVar243._20_4_ = 0x7fffffff;
      auVar243._24_4_ = 0x7fffffff;
      auVar243._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(ZEXT1632(auVar86),auVar243);
      auVar95 = vmaxps_avx(_local_6e0,auVar135);
      local_300 = auVar95;
      auVar205._8_4_ = 0x3e99999a;
      auVar205._0_8_ = 0x3e99999a3e99999a;
      auVar205._12_4_ = 0x3e99999a;
      auVar205._16_4_ = 0x3e99999a;
      auVar205._20_4_ = 0x3e99999a;
      auVar205._24_4_ = 0x3e99999a;
      auVar205._28_4_ = 0x3e99999a;
      uVar20 = vcmpps_avx512vl(auVar105,auVar205,1);
      local_500._0_2_ = (short)uVar20;
      uVar20 = vcmpps_avx512vl(_local_6e0,local_1e0,2);
      bVar73 = (byte)uVar20 & bVar67;
      uVar21 = vcmpps_avx512vl(auVar95,local_2e0,2);
      auVar254 = ZEXT3264(local_880);
      auVar256 = ZEXT3264(local_8a0);
      auVar257 = ZEXT3264(local_8c0);
      auVar258 = ZEXT3264(local_8e0);
      if ((bVar67 & ((byte)uVar21 | (byte)uVar20)) == 0) {
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar104);
        auVar244 = ZEXT3264(local_640);
        auVar232 = ZEXT3264(local_7e0);
      }
      else {
        auVar57._4_4_ = local_620._4_4_ * auVar251._4_4_;
        auVar57._0_4_ = local_620._0_4_ * auVar251._0_4_;
        auVar57._8_4_ = local_620._8_4_ * auVar251._8_4_;
        auVar57._12_4_ = local_620._12_4_ * auVar251._12_4_;
        auVar57._16_4_ = local_620._16_4_ * auVar251._16_4_;
        auVar57._20_4_ = local_620._20_4_ * auVar251._20_4_;
        auVar57._24_4_ = local_620._24_4_ * auVar251._24_4_;
        auVar57._28_4_ = 0x3e99999a;
        auVar86 = vfmadd213ps_fma(auVar110,local_540,auVar57);
        auVar86 = vfmadd213ps_fma(auVar104,_local_520,ZEXT1632(auVar86));
        auVar104 = vandps_avx(ZEXT1632(auVar86),auVar243);
        uVar20 = vcmpps_avx512vl(auVar104,auVar205,1);
        bVar79 = (byte)uVar20 | ~bVar69;
        auVar158._8_4_ = 2;
        auVar158._0_8_ = 0x200000002;
        auVar158._12_4_ = 2;
        auVar158._16_4_ = 2;
        auVar158._20_4_ = 2;
        auVar158._24_4_ = 2;
        auVar158._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar104 = vpblendmd_avx512vl(auVar158,auVar35);
        local_2a0._0_4_ = (uint)(bVar79 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
        bVar11 = (bool)(bVar79 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar11 * auVar104._24_4_ | (uint)!bVar11 * 2;
        local_2a0._28_4_ = (uint)(bVar79 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
        local_480 = vpbroadcastd_avx512vl();
        uVar20 = vpcmpd_avx512vl(local_480,local_2a0,5);
        bVar79 = (byte)uVar20 & bVar73;
        if (bVar79 == 0) {
          auVar160._4_4_ = uVar82;
          auVar160._0_4_ = uVar82;
          auVar160._8_4_ = uVar82;
          auVar160._12_4_ = uVar82;
          auVar160._16_4_ = uVar82;
          auVar160._20_4_ = uVar82;
          auVar160._24_4_ = uVar82;
          auVar160._28_4_ = uVar82;
        }
        else {
          local_2c0 = auVar95;
          auVar87 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar86 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar83 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vminps_avx(auVar87,auVar83);
          auVar87 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar83 = vmaxps_avx(auVar86,auVar87);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar88,auVar186);
          auVar87 = vandps_avx(auVar83,auVar186);
          auVar86 = vmaxps_avx(auVar86,auVar87);
          auVar87 = vmovshdup_avx(auVar86);
          auVar87 = vmaxss_avx(auVar87,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar87);
          fVar148 = auVar86._0_4_ * 1.9073486e-06;
          local_730 = vshufps_avx(auVar83,auVar83,0xff);
          local_4e0 = (float)local_7c0._0_4_ + (float)local_6e0._0_4_;
          fStack_4dc = (float)local_7c0._4_4_ + (float)local_6e0._4_4_;
          fStack_4d8 = fStack_7b8 + fStack_6d8;
          fStack_4d4 = fStack_7b4 + fStack_6d4;
          fStack_4d0 = fStack_7b0 + fStack_6d0;
          fStack_4cc = fStack_7ac + fStack_6cc;
          fStack_4c8 = fStack_7a8 + fStack_6c8;
          fStack_4c4 = fStack_7a4 + fStack_6c4;
          do {
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar104 = vblendmps_avx512vl(auVar159,_local_6e0);
            auVar137._0_4_ =
                 (uint)(bVar79 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar137._24_4_ =
                 (uint)(bVar79 >> 6) * auVar104._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar104 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar104 = vminps_avx(auVar137,auVar104);
            auVar105 = vshufpd_avx(auVar104,auVar104,5);
            auVar104 = vminps_avx(auVar104,auVar105);
            auVar105 = vpermpd_avx2(auVar104,0x4e);
            auVar104 = vminps_avx(auVar104,auVar105);
            uVar20 = vcmpps_avx512vl(auVar137,auVar104,0);
            bVar68 = (byte)uVar20 & bVar79;
            bVar70 = bVar79;
            if (bVar68 != 0) {
              bVar70 = bVar68;
            }
            iVar2 = 0;
            for (uVar82 = (uint)bVar70; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar82 = *(uint *)(local_1a0 + (uint)(iVar2 << 2));
            fVar175 = auVar19._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
              fVar175 = sqrtf((float)local_800._0_4_);
              auVar86 = local_860._0_16_;
            }
            auVar86 = vinsertps_avx(auVar86,ZEXT416(uVar82),0x10);
            lVar78 = 5;
            do {
              uVar163 = auVar86._0_4_;
              auVar150._4_4_ = uVar163;
              auVar150._0_4_ = uVar163;
              auVar150._8_4_ = uVar163;
              auVar150._12_4_ = uVar163;
              auVar83 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_7f0);
              auVar87 = vmovshdup_avx(auVar86);
              local_5a0._0_16_ = auVar87;
              fVar183 = 1.0 - auVar87._0_4_;
              auVar87 = vshufps_avx(auVar86,auVar86,0x55);
              fVar177 = auVar87._0_4_;
              auVar187._0_4_ = local_6a0._0_4_ * fVar177;
              fVar179 = auVar87._4_4_;
              auVar187._4_4_ = local_6a0._4_4_ * fVar179;
              fVar149 = auVar87._8_4_;
              auVar187._8_4_ = local_6a0._8_4_ * fVar149;
              fVar181 = auVar87._12_4_;
              auVar187._12_4_ = local_6a0._12_4_ * fVar181;
              _local_580 = ZEXT416((uint)fVar183);
              auVar210._4_4_ = fVar183;
              auVar210._0_4_ = fVar183;
              auVar210._8_4_ = fVar183;
              auVar210._12_4_ = fVar183;
              auVar87 = vfmadd231ps_fma(auVar187,auVar210,local_660._0_16_);
              auVar225._0_4_ = local_680._0_4_ * fVar177;
              auVar225._4_4_ = local_680._4_4_ * fVar179;
              auVar225._8_4_ = local_680._8_4_ * fVar149;
              auVar225._12_4_ = local_680._12_4_ * fVar181;
              auVar88 = vfmadd231ps_fma(auVar225,auVar210,local_6a0._0_16_);
              auVar234._0_4_ = fVar177 * (float)local_6c0._0_4_;
              auVar234._4_4_ = fVar179 * (float)local_6c0._4_4_;
              auVar234._8_4_ = fVar149 * fStack_6b8;
              auVar234._12_4_ = fVar181 * fStack_6b4;
              auVar89 = vfmadd231ps_fma(auVar234,auVar210,local_680._0_16_);
              auVar241._0_4_ = fVar177 * auVar88._0_4_;
              auVar241._4_4_ = fVar179 * auVar88._4_4_;
              auVar241._8_4_ = fVar149 * auVar88._8_4_;
              auVar241._12_4_ = fVar181 * auVar88._12_4_;
              auVar87 = vfmadd231ps_fma(auVar241,auVar210,auVar87);
              auVar188._0_4_ = fVar177 * auVar89._0_4_;
              auVar188._4_4_ = fVar179 * auVar89._4_4_;
              auVar188._8_4_ = fVar149 * auVar89._8_4_;
              auVar188._12_4_ = fVar181 * auVar89._12_4_;
              auVar88 = vfmadd231ps_fma(auVar188,auVar210,auVar88);
              auVar226._0_4_ = fVar177 * auVar88._0_4_;
              auVar226._4_4_ = fVar179 * auVar88._4_4_;
              auVar226._8_4_ = fVar149 * auVar88._8_4_;
              auVar226._12_4_ = fVar181 * auVar88._12_4_;
              auVar89 = vfmadd231ps_fma(auVar226,auVar87,auVar210);
              auVar87 = vsubps_avx(auVar88,auVar87);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar88 = vmulps_avx512vl(auVar87,auVar23);
              local_560._0_16_ = auVar89;
              auVar83 = vsubps_avx(auVar83,auVar89);
              auVar87 = vdpps_avx(auVar83,auVar83,0x7f);
              local_860._0_16_ = auVar87;
              local_780 = ZEXT1632(auVar86);
              if (auVar87._0_4_ < 0.0) {
                auVar232._0_4_ = sqrtf(auVar87._0_4_);
                auVar232._4_60_ = extraout_var;
                auVar86 = auVar232._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar87,auVar87);
              }
              local_5c0._0_16_ = vdpps_avx(auVar88,auVar88,0x7f);
              fVar177 = local_5c0._0_4_;
              auVar189._4_12_ = ZEXT812(0) << 0x20;
              auVar189._0_4_ = fVar177;
              local_820._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              fVar179 = local_820._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar89 = vxorps_avx512vl(local_5c0._0_16_,auVar24);
              auVar87 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar87._0_4_;
              local_7a0._0_4_ = auVar86._0_4_;
              if (fVar177 < auVar89._0_4_) {
                fVar149 = sqrtf(fVar177);
                auVar86 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar87 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar149 = auVar87._0_4_;
              }
              fVar181 = local_820._0_4_;
              fVar177 = fVar179 * 1.5 + fVar177 * -0.5 * fVar181 * fVar181 * fVar181;
              auVar151._0_4_ = auVar88._0_4_ * fVar177;
              auVar151._4_4_ = auVar88._4_4_ * fVar177;
              auVar151._8_4_ = auVar88._8_4_ * fVar177;
              auVar151._12_4_ = auVar88._12_4_ * fVar177;
              local_820._0_16_ = vdpps_avx(auVar83,auVar151,0x7f);
              auVar84 = vaddss_avx512f(auVar86,ZEXT416(0x3f800000));
              auVar152._0_4_ = local_820._0_4_ * local_820._0_4_;
              auVar152._4_4_ = local_820._4_4_ * local_820._4_4_;
              auVar152._8_4_ = local_820._8_4_ * local_820._8_4_;
              auVar152._12_4_ = local_820._12_4_ * local_820._12_4_;
              auVar87 = vsubps_avx(local_860._0_16_,auVar152);
              fVar179 = auVar87._0_4_;
              auVar165._4_12_ = ZEXT812(0) << 0x20;
              auVar165._0_4_ = fVar179;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
              auVar90 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              uVar81 = fVar179 == 0.0;
              uVar80 = fVar179 < 0.0;
              if ((bool)uVar80) {
                local_710._0_4_ = auVar91._0_4_;
                local_720 = fVar177;
                fStack_71c = fVar177;
                fStack_718 = fVar177;
                fStack_714 = fVar177;
                local_700 = auVar89;
                fVar179 = sqrtf(fVar179);
                auVar91 = ZEXT416((uint)local_710._0_4_);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar86 = ZEXT416((uint)local_7a0._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar89 = local_700;
                fVar177 = local_720;
                fVar181 = fStack_71c;
                fVar183 = fStack_718;
                fVar208 = fStack_714;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar179 = auVar87._0_4_;
                fVar181 = fVar177;
                fVar183 = fVar177;
                fVar208 = fVar177;
              }
              auVar254 = ZEXT3264(local_880);
              auVar256 = ZEXT3264(local_8a0);
              auVar257 = ZEXT3264(local_8c0);
              auVar258 = ZEXT3264(local_8e0);
              auVar259 = ZEXT3264(local_900);
              auVar233 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_)
              ;
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar162 = auVar87._0_4_ * 6.0;
              fVar176 = local_5a0._0_4_ * 6.0;
              auVar211._0_4_ = fVar176 * (float)local_6c0._0_4_;
              auVar211._4_4_ = fVar176 * (float)local_6c0._4_4_;
              auVar211._8_4_ = fVar176 * fStack_6b8;
              auVar211._12_4_ = fVar176 * fStack_6b4;
              auVar190._4_4_ = fVar162;
              auVar190._0_4_ = fVar162;
              auVar190._8_4_ = fVar162;
              auVar190._12_4_ = fVar162;
              auVar87 = vfmadd132ps_fma(auVar190,auVar211,local_680._0_16_);
              fVar162 = auVar233._0_4_ * 6.0;
              auVar166._4_4_ = fVar162;
              auVar166._0_4_ = fVar162;
              auVar166._8_4_ = fVar162;
              auVar166._12_4_ = fVar162;
              auVar87 = vfmadd132ps_fma(auVar166,auVar87,local_6a0._0_16_);
              fVar162 = local_580._0_4_ * 6.0;
              auVar191._4_4_ = fVar162;
              auVar191._0_4_ = fVar162;
              auVar191._8_4_ = fVar162;
              auVar191._12_4_ = fVar162;
              auVar87 = vfmadd132ps_fma(auVar191,auVar87,local_660._0_16_);
              auVar167._0_4_ = auVar87._0_4_ * (float)local_5c0._0_4_;
              auVar167._4_4_ = auVar87._4_4_ * (float)local_5c0._0_4_;
              auVar167._8_4_ = auVar87._8_4_ * (float)local_5c0._0_4_;
              auVar167._12_4_ = auVar87._12_4_ * (float)local_5c0._0_4_;
              auVar87 = vdpps_avx(auVar88,auVar87,0x7f);
              fVar162 = auVar87._0_4_;
              auVar192._0_4_ = auVar88._0_4_ * fVar162;
              auVar192._4_4_ = auVar88._4_4_ * fVar162;
              auVar192._8_4_ = auVar88._8_4_ * fVar162;
              auVar192._12_4_ = auVar88._12_4_ * fVar162;
              auVar87 = vsubps_avx(auVar167,auVar192);
              fVar162 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar233 = vmaxss_avx(ZEXT416((uint)fVar148),
                                    ZEXT416((uint)(local_780._0_4_ * fVar175 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar88,auVar25);
              auVar193._0_4_ = fVar177 * auVar87._0_4_ * fVar162;
              auVar193._4_4_ = fVar181 * auVar87._4_4_ * fVar162;
              auVar193._8_4_ = fVar183 * auVar87._8_4_ * fVar162;
              auVar193._12_4_ = fVar208 * auVar87._12_4_ * fVar162;
              auVar87 = vdpps_avx(auVar92,auVar151,0x7f);
              auVar240 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar148),auVar233);
              auVar86 = vdpps_avx(auVar83,auVar193,0x7f);
              vfmadd213ss_avx512f(auVar84,ZEXT416((uint)(fVar148 / fVar149)),auVar240);
              fVar177 = auVar87._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_7f0,auVar151,0x7f);
              auVar87 = vdpps_avx(auVar83,auVar92,0x7f);
              auVar84 = vmulss_avx512f(auVar91,auVar89);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar90 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar84._0_4_ * auVar89._0_4_)));
              auVar89 = vdpps_avx(auVar83,local_7f0,0x7f);
              auVar91 = vfnmadd231ss_avx512f(auVar87,local_820._0_16_,ZEXT416((uint)fVar177));
              auVar89 = vfnmadd231ss_avx512f(auVar89,local_820._0_16_,auVar86);
              auVar87 = vpermilps_avx(local_560._0_16_,0xff);
              fVar179 = fVar179 - auVar87._0_4_;
              auVar84 = vshufps_avx(auVar88,auVar88,0xff);
              auVar87 = vfmsub213ss_fma(auVar91,auVar90,auVar84);
              auVar245._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar89 = ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_));
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                        ZEXT416((uint)fVar177),auVar89);
              auVar87 = vinsertps_avx(auVar245,auVar89,0x1c);
              auVar235._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar89 = vinsertps_avx(ZEXT416((uint)fVar177),auVar235,0x10);
              auVar212._0_4_ = auVar90._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar86 = vdivps_avx(auVar87,auVar212);
              auVar87 = vdivps_avx(auVar89,auVar212);
              auVar89 = vbroadcastss_avx512vl(local_820._0_16_);
              auVar213._0_4_ = auVar89._0_4_ * auVar86._0_4_ + fVar179 * auVar87._0_4_;
              auVar213._4_4_ = auVar89._4_4_ * auVar86._4_4_ + fVar179 * auVar87._4_4_;
              auVar213._8_4_ = auVar89._8_4_ * auVar86._8_4_ + fVar179 * auVar87._8_4_;
              auVar213._12_4_ = auVar89._12_4_ * auVar86._12_4_ + fVar179 * auVar87._12_4_;
              auVar86 = vsubps_avx(local_780._0_16_,auVar213);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(local_820._0_16_,auVar26);
              auVar87 = vucomiss_avx512f(auVar87);
              if (!(bool)uVar80 && !(bool)uVar81) {
                auVar87 = vaddss_avx512f(auVar233,auVar87);
                auVar87 = vfmadd231ss_fma(auVar87,local_730,ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx512vl(ZEXT416((uint)fVar179),auVar27);
                if (auVar89._0_4_ < auVar87._0_4_) {
                  fVar175 = auVar86._0_4_ + (float)local_740._0_4_;
                  if ((fVar175 < fVar209) ||
                     (fVar177 = *(float *)(ray + k * 4 + 0x100), fVar177 < fVar175)) break;
                  auVar87 = vmovshdup_avx(auVar86);
                  fVar179 = auVar87._0_4_;
                  if ((fVar179 < 0.0) || (1.0 < fVar179)) break;
                  auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_860._0_4_));
                  fVar149 = auVar87._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar77].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar149 = fVar149 * 1.5 +
                            (float)local_860._0_4_ * -0.5 * fVar149 * fVar149 * fVar149;
                  auVar214._0_4_ = auVar83._0_4_ * fVar149;
                  auVar214._4_4_ = auVar83._4_4_ * fVar149;
                  auVar214._8_4_ = auVar83._8_4_ * fVar149;
                  auVar214._12_4_ = auVar83._12_4_ * fVar149;
                  auVar89 = vfmadd213ps_fma(auVar84,auVar214,auVar88);
                  auVar87 = vshufps_avx(auVar214,auVar214,0xc9);
                  auVar83 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar215._0_4_ = auVar214._0_4_ * auVar83._0_4_;
                  auVar215._4_4_ = auVar214._4_4_ * auVar83._4_4_;
                  auVar215._8_4_ = auVar214._8_4_ * auVar83._8_4_;
                  auVar215._12_4_ = auVar214._12_4_ * auVar83._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar215,auVar88,auVar87);
                  auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                  auVar153._0_4_ = auVar89._0_4_ * auVar88._0_4_;
                  auVar153._4_4_ = auVar89._4_4_ * auVar88._4_4_;
                  auVar153._8_4_ = auVar89._8_4_ * auVar88._8_4_;
                  auVar153._12_4_ = auVar89._12_4_ * auVar88._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar153,auVar87,auVar83);
                  uVar163 = auVar87._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar175;
                    uVar7 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar7;
                    uVar7 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar163;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar179;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar6;
                    *(uint *)(ray + k * 4 + 0x240) = uVar77;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar10 = context->user;
                  auVar223._8_4_ = 1;
                  auVar223._0_8_ = 0x100000001;
                  auVar223._12_4_ = 1;
                  auVar223._16_4_ = 1;
                  auVar223._20_4_ = 1;
                  auVar223._24_4_ = 1;
                  auVar223._28_4_ = 1;
                  local_3c0 = vpermps_avx2(auVar223,ZEXT1632(auVar86));
                  auVar104 = vpermps_avx2(auVar223,ZEXT1632(auVar87));
                  auVar230._8_4_ = 2;
                  auVar230._0_8_ = 0x200000002;
                  auVar230._12_4_ = 2;
                  auVar230._16_4_ = 2;
                  auVar230._20_4_ = 2;
                  auVar230._24_4_ = 2;
                  auVar230._28_4_ = 2;
                  local_400 = vpermps_avx2(auVar230,ZEXT1632(auVar87));
                  local_420[0] = (RTCHitN)auVar104[0];
                  local_420[1] = (RTCHitN)auVar104[1];
                  local_420[2] = (RTCHitN)auVar104[2];
                  local_420[3] = (RTCHitN)auVar104[3];
                  local_420[4] = (RTCHitN)auVar104[4];
                  local_420[5] = (RTCHitN)auVar104[5];
                  local_420[6] = (RTCHitN)auVar104[6];
                  local_420[7] = (RTCHitN)auVar104[7];
                  local_420[8] = (RTCHitN)auVar104[8];
                  local_420[9] = (RTCHitN)auVar104[9];
                  local_420[10] = (RTCHitN)auVar104[10];
                  local_420[0xb] = (RTCHitN)auVar104[0xb];
                  local_420[0xc] = (RTCHitN)auVar104[0xc];
                  local_420[0xd] = (RTCHitN)auVar104[0xd];
                  local_420[0xe] = (RTCHitN)auVar104[0xe];
                  local_420[0xf] = (RTCHitN)auVar104[0xf];
                  local_420[0x10] = (RTCHitN)auVar104[0x10];
                  local_420[0x11] = (RTCHitN)auVar104[0x11];
                  local_420[0x12] = (RTCHitN)auVar104[0x12];
                  local_420[0x13] = (RTCHitN)auVar104[0x13];
                  local_420[0x14] = (RTCHitN)auVar104[0x14];
                  local_420[0x15] = (RTCHitN)auVar104[0x15];
                  local_420[0x16] = (RTCHitN)auVar104[0x16];
                  local_420[0x17] = (RTCHitN)auVar104[0x17];
                  local_420[0x18] = (RTCHitN)auVar104[0x18];
                  local_420[0x19] = (RTCHitN)auVar104[0x19];
                  local_420[0x1a] = (RTCHitN)auVar104[0x1a];
                  local_420[0x1b] = (RTCHitN)auVar104[0x1b];
                  local_420[0x1c] = (RTCHitN)auVar104[0x1c];
                  local_420[0x1d] = (RTCHitN)auVar104[0x1d];
                  local_420[0x1e] = (RTCHitN)auVar104[0x1e];
                  local_420[0x1f] = (RTCHitN)auVar104[0x1f];
                  local_3e0 = uVar163;
                  uStack_3dc = uVar163;
                  uStack_3d8 = uVar163;
                  uStack_3d4 = uVar163;
                  uStack_3d0 = uVar163;
                  uStack_3cc = uVar163;
                  uStack_3c8 = uVar163;
                  uStack_3c4 = uVar163;
                  local_3a0 = ZEXT432(0) << 0x20;
                  local_380 = local_460._0_8_;
                  uStack_378 = local_460._8_8_;
                  uStack_370 = local_460._16_8_;
                  uStack_368 = local_460._24_8_;
                  local_360 = local_440;
                  auVar104 = vpcmpeqd_avx2(local_440,local_440);
                  local_828[1] = auVar104;
                  *local_828 = auVar104;
                  local_340 = pRVar10->instID[0];
                  uStack_33c = local_340;
                  uStack_338 = local_340;
                  uStack_334 = local_340;
                  uStack_330 = local_340;
                  uStack_32c = local_340;
                  uStack_328 = local_340;
                  uStack_324 = local_340;
                  local_320 = pRVar10->instPrimID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  *(float *)(ray + k * 4 + 0x100) = fVar175;
                  local_760 = local_4a0;
                  local_930.valid = (int *)local_760;
                  local_930.geometryUserPtr = pGVar8->userPtr;
                  local_930.context = context->user;
                  local_930.hit = local_420;
                  local_930.N = 8;
                  local_930.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_930);
                    auVar259 = ZEXT3264(local_900);
                    auVar258 = ZEXT3264(local_8e0);
                    auVar257 = ZEXT3264(local_8c0);
                    auVar256 = ZEXT3264(local_8a0);
                    auVar254 = ZEXT3264(local_880);
                  }
                  if (local_760 != (undefined1  [32])0x0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_930);
                      auVar259 = ZEXT3264(local_900);
                      auVar258 = ZEXT3264(local_8e0);
                      auVar257 = ZEXT3264(local_8c0);
                      auVar256 = ZEXT3264(local_8a0);
                      auVar254 = ZEXT3264(local_880);
                    }
                    if (local_760 != (undefined1  [32])0x0) {
                      uVar76 = vptestmd_avx512vl(local_760,local_760);
                      iVar3 = *(int *)(local_930.hit + 4);
                      iVar4 = *(int *)(local_930.hit + 8);
                      iVar1 = *(int *)(local_930.hit + 0xc);
                      iVar59 = *(int *)(local_930.hit + 0x10);
                      iVar60 = *(int *)(local_930.hit + 0x14);
                      iVar61 = *(int *)(local_930.hit + 0x18);
                      iVar62 = *(int *)(local_930.hit + 0x1c);
                      bVar70 = (byte)uVar76;
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x180) =
                           (uint)(bVar70 & 1) * *(int *)local_930.hit |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_930.ray + 0x180);
                      *(uint *)(local_930.ray + 0x184) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x184);
                      *(uint *)(local_930.ray + 0x188) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x188);
                      *(uint *)(local_930.ray + 0x18c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x18c);
                      *(uint *)(local_930.ray + 400) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 400);
                      *(uint *)(local_930.ray + 0x194) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x194);
                      *(uint *)(local_930.ray + 0x198) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x198);
                      *(uint *)(local_930.ray + 0x19c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x19c);
                      iVar3 = *(int *)(local_930.hit + 0x24);
                      iVar4 = *(int *)(local_930.hit + 0x28);
                      iVar1 = *(int *)(local_930.hit + 0x2c);
                      iVar59 = *(int *)(local_930.hit + 0x30);
                      iVar60 = *(int *)(local_930.hit + 0x34);
                      iVar61 = *(int *)(local_930.hit + 0x38);
                      iVar62 = *(int *)(local_930.hit + 0x3c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x1a0) =
                           (uint)(bVar70 & 1) * *(int *)(local_930.hit + 0x20) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_930.ray + 0x1a0);
                      *(uint *)(local_930.ray + 0x1a4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x1a4);
                      *(uint *)(local_930.ray + 0x1a8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x1a8);
                      *(uint *)(local_930.ray + 0x1ac) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x1ac);
                      *(uint *)(local_930.ray + 0x1b0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x1b0);
                      *(uint *)(local_930.ray + 0x1b4) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x1b4);
                      *(uint *)(local_930.ray + 0x1b8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x1b8);
                      *(uint *)(local_930.ray + 0x1bc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x1bc);
                      iVar3 = *(int *)(local_930.hit + 0x44);
                      iVar4 = *(int *)(local_930.hit + 0x48);
                      iVar1 = *(int *)(local_930.hit + 0x4c);
                      iVar59 = *(int *)(local_930.hit + 0x50);
                      iVar60 = *(int *)(local_930.hit + 0x54);
                      iVar61 = *(int *)(local_930.hit + 0x58);
                      iVar62 = *(int *)(local_930.hit + 0x5c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x1c0) =
                           (uint)(bVar70 & 1) * *(int *)(local_930.hit + 0x40) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_930.ray + 0x1c0);
                      *(uint *)(local_930.ray + 0x1c4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x1c4);
                      *(uint *)(local_930.ray + 0x1c8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x1c8);
                      *(uint *)(local_930.ray + 0x1cc) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x1cc);
                      *(uint *)(local_930.ray + 0x1d0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x1d0);
                      *(uint *)(local_930.ray + 0x1d4) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x1d4);
                      *(uint *)(local_930.ray + 0x1d8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x1d8);
                      *(uint *)(local_930.ray + 0x1dc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x1dc);
                      iVar3 = *(int *)(local_930.hit + 100);
                      iVar4 = *(int *)(local_930.hit + 0x68);
                      iVar1 = *(int *)(local_930.hit + 0x6c);
                      iVar59 = *(int *)(local_930.hit + 0x70);
                      iVar60 = *(int *)(local_930.hit + 0x74);
                      iVar61 = *(int *)(local_930.hit + 0x78);
                      iVar62 = *(int *)(local_930.hit + 0x7c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x1e0) =
                           (uint)(bVar70 & 1) * *(int *)(local_930.hit + 0x60) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_930.ray + 0x1e0);
                      *(uint *)(local_930.ray + 0x1e4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x1e4);
                      *(uint *)(local_930.ray + 0x1e8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x1e8);
                      *(uint *)(local_930.ray + 0x1ec) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x1ec);
                      *(uint *)(local_930.ray + 0x1f0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x1f0);
                      *(uint *)(local_930.ray + 500) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 500);
                      *(uint *)(local_930.ray + 0x1f8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x1f8);
                      *(uint *)(local_930.ray + 0x1fc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x1fc);
                      iVar3 = *(int *)(local_930.hit + 0x84);
                      iVar4 = *(int *)(local_930.hit + 0x88);
                      iVar1 = *(int *)(local_930.hit + 0x8c);
                      iVar59 = *(int *)(local_930.hit + 0x90);
                      iVar60 = *(int *)(local_930.hit + 0x94);
                      iVar61 = *(int *)(local_930.hit + 0x98);
                      iVar62 = *(int *)(local_930.hit + 0x9c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x200) =
                           (uint)(bVar70 & 1) * *(int *)(local_930.hit + 0x80) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_930.ray + 0x200);
                      *(uint *)(local_930.ray + 0x204) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x204);
                      *(uint *)(local_930.ray + 0x208) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x208);
                      *(uint *)(local_930.ray + 0x20c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x20c);
                      *(uint *)(local_930.ray + 0x210) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x210);
                      *(uint *)(local_930.ray + 0x214) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x214);
                      *(uint *)(local_930.ray + 0x218) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x218);
                      *(uint *)(local_930.ray + 0x21c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x21c);
                      auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0xa0));
                      *(undefined1 (*) [32])(local_930.ray + 0x220) = auVar104;
                      auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0xc0));
                      *(undefined1 (*) [32])(local_930.ray + 0x240) = auVar104;
                      auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0xe0));
                      *(undefined1 (*) [32])(local_930.ray + 0x260) = auVar104;
                      auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0x100));
                      *(undefined1 (*) [32])(local_930.ray + 0x280) = auVar104;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar177;
                  break;
                }
              }
              lVar78 = lVar78 + -1;
            } while (lVar78 != 0);
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar160._4_4_ = uVar163;
            auVar160._0_4_ = uVar163;
            auVar160._8_4_ = uVar163;
            auVar160._12_4_ = uVar163;
            auVar160._16_4_ = uVar163;
            auVar160._20_4_ = uVar163;
            auVar160._24_4_ = uVar163;
            auVar160._28_4_ = uVar163;
            auVar63._4_4_ = fStack_4dc;
            auVar63._0_4_ = local_4e0;
            auVar63._8_4_ = fStack_4d8;
            auVar63._12_4_ = fStack_4d4;
            auVar63._16_4_ = fStack_4d0;
            auVar63._20_4_ = fStack_4cc;
            auVar63._24_4_ = fStack_4c8;
            auVar63._28_4_ = fStack_4c4;
            uVar20 = vcmpps_avx512vl(auVar160,auVar63,0xd);
            bVar79 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar79 & (byte)uVar20;
          } while (bVar79 != 0);
          auVar95 = local_2c0;
        }
        bVar69 = local_500[0] | ~bVar69;
        auVar173._0_4_ = (float)local_7c0._0_4_ + auVar95._0_4_;
        auVar173._4_4_ = (float)local_7c0._4_4_ + auVar95._4_4_;
        auVar173._8_4_ = fStack_7b8 + auVar95._8_4_;
        auVar173._12_4_ = fStack_7b4 + auVar95._12_4_;
        auVar173._16_4_ = fStack_7b0 + auVar95._16_4_;
        auVar173._20_4_ = fStack_7ac + auVar95._20_4_;
        auVar173._24_4_ = fStack_7a8 + auVar95._24_4_;
        auVar173._28_4_ = fStack_7a4 + auVar95._28_4_;
        uVar20 = vcmpps_avx512vl(auVar173,auVar160,2);
        bVar67 = (byte)uVar21 & bVar67 & (byte)uVar20;
        auVar174._8_4_ = 2;
        auVar174._0_8_ = 0x200000002;
        auVar174._12_4_ = 2;
        auVar174._16_4_ = 2;
        auVar174._20_4_ = 2;
        auVar174._24_4_ = 2;
        auVar174._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar104 = vpblendmd_avx512vl(auVar174,auVar36);
        auVar138._0_4_ = (uint)(bVar69 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar69 & 1) * 2;
        bVar11 = (bool)(bVar69 >> 1 & 1);
        auVar138._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar69 >> 2 & 1);
        auVar138._8_4_ = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar69 >> 3 & 1);
        auVar138._12_4_ = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar69 >> 4 & 1);
        auVar138._16_4_ = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar69 >> 5 & 1);
        auVar138._20_4_ = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar69 >> 6 & 1);
        auVar138._24_4_ = (uint)bVar11 * auVar104._24_4_ | (uint)!bVar11 * 2;
        auVar138._28_4_ = (uint)(bVar69 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar69 >> 7) * 2;
        uVar20 = vpcmpd_avx512vl(local_480,auVar138,5);
        bVar69 = (byte)uVar20 & bVar67;
        fVar148 = (float)local_7c0._0_4_;
        fVar175 = (float)local_7c0._4_4_;
        fVar177 = fStack_7b8;
        fVar179 = fStack_7b4;
        fVar149 = fStack_7b0;
        fVar181 = fStack_7ac;
        fVar183 = fStack_7a8;
        fVar208 = fStack_7a4;
        if (bVar69 != 0) {
          auVar87 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar86 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar83 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vminps_avx(auVar87,auVar83);
          auVar87 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar83 = vmaxps_avx(auVar86,auVar87);
          auVar194._8_4_ = 0x7fffffff;
          auVar194._0_8_ = 0x7fffffff7fffffff;
          auVar194._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar88,auVar194);
          auVar87 = vandps_avx(auVar83,auVar194);
          auVar86 = vmaxps_avx(auVar86,auVar87);
          auVar87 = vmovshdup_avx(auVar86);
          auVar87 = vmaxss_avx(auVar87,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar87);
          fVar148 = auVar86._0_4_ * 1.9073486e-06;
          local_730 = vshufps_avx(auVar83,auVar83,0xff);
          local_4e0 = (float)local_7c0._0_4_ + local_300._0_4_;
          fStack_4dc = (float)local_7c0._4_4_ + local_300._4_4_;
          fStack_4d8 = fStack_7b8 + local_300._8_4_;
          fStack_4d4 = fStack_7b4 + local_300._12_4_;
          fStack_4d0 = fStack_7b0 + local_300._16_4_;
          fStack_4cc = fStack_7ac + local_300._20_4_;
          fStack_4c8 = fStack_7a8 + local_300._24_4_;
          fStack_4c4 = fStack_7a4 + local_300._28_4_;
          _local_6e0 = local_300;
          local_500 = auVar138;
          do {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar104 = vblendmps_avx512vl(auVar161,_local_6e0);
            auVar139._0_4_ =
                 (uint)(bVar69 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar69 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar69 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar69 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar69 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar69 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar139._24_4_ =
                 (uint)(bVar69 >> 6) * auVar104._24_4_ | (uint)!(bool)(bVar69 >> 6) * 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar104 = vshufps_avx(auVar139,auVar139,0xb1);
            auVar104 = vminps_avx(auVar139,auVar104);
            auVar105 = vshufpd_avx(auVar104,auVar104,5);
            auVar104 = vminps_avx(auVar104,auVar105);
            auVar105 = vpermpd_avx2(auVar104,0x4e);
            auVar104 = vminps_avx(auVar104,auVar105);
            uVar20 = vcmpps_avx512vl(auVar139,auVar104,0);
            bVar70 = (byte)uVar20 & bVar69;
            bVar79 = bVar69;
            if (bVar70 != 0) {
              bVar79 = bVar70;
            }
            iVar2 = 0;
            for (uVar82 = (uint)bVar79; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar82 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
            fVar175 = auVar85._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar2 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar2 << 2)));
              fVar175 = sqrtf((float)local_800._0_4_);
              auVar86 = local_860._0_16_;
            }
            auVar86 = vinsertps_avx(auVar86,ZEXT416(uVar82),0x10);
            lVar78 = 5;
            do {
              uVar163 = auVar86._0_4_;
              auVar154._4_4_ = uVar163;
              auVar154._0_4_ = uVar163;
              auVar154._8_4_ = uVar163;
              auVar154._12_4_ = uVar163;
              auVar83 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_7f0);
              auVar87 = vmovshdup_avx(auVar86);
              local_5a0._0_16_ = auVar87;
              fVar183 = 1.0 - auVar87._0_4_;
              auVar87 = vshufps_avx(auVar86,auVar86,0x55);
              fVar177 = auVar87._0_4_;
              auVar195._0_4_ = local_6a0._0_4_ * fVar177;
              fVar179 = auVar87._4_4_;
              auVar195._4_4_ = local_6a0._4_4_ * fVar179;
              fVar149 = auVar87._8_4_;
              auVar195._8_4_ = local_6a0._8_4_ * fVar149;
              fVar181 = auVar87._12_4_;
              auVar195._12_4_ = local_6a0._12_4_ * fVar181;
              _local_580 = ZEXT416((uint)fVar183);
              auVar216._4_4_ = fVar183;
              auVar216._0_4_ = fVar183;
              auVar216._8_4_ = fVar183;
              auVar216._12_4_ = fVar183;
              auVar87 = vfmadd231ps_fma(auVar195,auVar216,local_660._0_16_);
              auVar227._0_4_ = local_680._0_4_ * fVar177;
              auVar227._4_4_ = local_680._4_4_ * fVar179;
              auVar227._8_4_ = local_680._8_4_ * fVar149;
              auVar227._12_4_ = local_680._12_4_ * fVar181;
              auVar88 = vfmadd231ps_fma(auVar227,auVar216,local_6a0._0_16_);
              auVar236._0_4_ = fVar177 * (float)local_6c0._0_4_;
              auVar236._4_4_ = fVar179 * (float)local_6c0._4_4_;
              auVar236._8_4_ = fVar149 * fStack_6b8;
              auVar236._12_4_ = fVar181 * fStack_6b4;
              auVar89 = vfmadd231ps_fma(auVar236,auVar216,local_680._0_16_);
              auVar242._0_4_ = fVar177 * auVar88._0_4_;
              auVar242._4_4_ = fVar179 * auVar88._4_4_;
              auVar242._8_4_ = fVar149 * auVar88._8_4_;
              auVar242._12_4_ = fVar181 * auVar88._12_4_;
              auVar87 = vfmadd231ps_fma(auVar242,auVar216,auVar87);
              auVar196._0_4_ = fVar177 * auVar89._0_4_;
              auVar196._4_4_ = fVar179 * auVar89._4_4_;
              auVar196._8_4_ = fVar149 * auVar89._8_4_;
              auVar196._12_4_ = fVar181 * auVar89._12_4_;
              auVar88 = vfmadd231ps_fma(auVar196,auVar216,auVar88);
              auVar228._0_4_ = fVar177 * auVar88._0_4_;
              auVar228._4_4_ = fVar179 * auVar88._4_4_;
              auVar228._8_4_ = fVar149 * auVar88._8_4_;
              auVar228._12_4_ = fVar181 * auVar88._12_4_;
              auVar89 = vfmadd231ps_fma(auVar228,auVar87,auVar216);
              auVar87 = vsubps_avx(auVar88,auVar87);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar88 = vmulps_avx512vl(auVar87,auVar28);
              local_560._0_16_ = auVar89;
              auVar83 = vsubps_avx(auVar83,auVar89);
              auVar87 = vdpps_avx(auVar83,auVar83,0x7f);
              local_860._0_16_ = auVar87;
              local_780 = ZEXT1632(auVar86);
              if (auVar87._0_4_ < 0.0) {
                auVar254._0_4_ = sqrtf(auVar87._0_4_);
                auVar254._4_60_ = extraout_var_00;
                auVar86 = auVar254._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar87,auVar87);
              }
              local_5c0._0_16_ = vdpps_avx(auVar88,auVar88,0x7f);
              fVar177 = local_5c0._0_4_;
              auVar197._4_12_ = ZEXT812(0) << 0x20;
              auVar197._0_4_ = fVar177;
              local_820._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              fVar179 = local_820._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar89 = vxorps_avx512vl(local_5c0._0_16_,auVar29);
              auVar87 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar87._0_4_;
              local_7a0._0_4_ = auVar86._0_4_;
              if (fVar177 < auVar89._0_4_) {
                fVar149 = sqrtf(fVar177);
                auVar86 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar87 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar149 = auVar87._0_4_;
              }
              fVar181 = local_820._0_4_;
              fVar177 = fVar179 * 1.5 + fVar177 * -0.5 * fVar181 * fVar181 * fVar181;
              auVar255._0_4_ = auVar88._0_4_ * fVar177;
              auVar255._4_4_ = auVar88._4_4_ * fVar177;
              auVar255._8_4_ = auVar88._8_4_ * fVar177;
              auVar255._12_4_ = auVar88._12_4_ * fVar177;
              local_820._0_16_ = vdpps_avx(auVar83,auVar255,0x7f);
              auVar84 = vaddss_avx512f(auVar86,ZEXT416(0x3f800000));
              auVar155._0_4_ = local_820._0_4_ * local_820._0_4_;
              auVar155._4_4_ = local_820._4_4_ * local_820._4_4_;
              auVar155._8_4_ = local_820._8_4_ * local_820._8_4_;
              auVar155._12_4_ = local_820._12_4_ * local_820._12_4_;
              auVar87 = vsubps_avx(local_860._0_16_,auVar155);
              fVar179 = auVar87._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar179;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              auVar90 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              uVar81 = fVar179 == 0.0;
              uVar80 = fVar179 < 0.0;
              if ((bool)uVar80) {
                local_720 = auVar91._0_4_;
                local_710 = auVar255;
                local_700 = auVar89;
                fVar179 = sqrtf(fVar179);
                auVar91 = ZEXT416((uint)local_720);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar86 = ZEXT416((uint)local_7a0._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar255 = local_710;
                auVar89 = local_700;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar179 = auVar87._0_4_;
              }
              auVar254 = ZEXT3264(local_880);
              auVar256 = ZEXT3264(local_8a0);
              auVar257 = ZEXT3264(local_8c0);
              auVar258 = ZEXT3264(local_8e0);
              auVar259 = ZEXT3264(local_900);
              auVar233 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_)
              ;
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar181 = auVar87._0_4_ * 6.0;
              fVar183 = local_5a0._0_4_ * 6.0;
              auVar217._0_4_ = fVar183 * (float)local_6c0._0_4_;
              auVar217._4_4_ = fVar183 * (float)local_6c0._4_4_;
              auVar217._8_4_ = fVar183 * fStack_6b8;
              auVar217._12_4_ = fVar183 * fStack_6b4;
              auVar198._4_4_ = fVar181;
              auVar198._0_4_ = fVar181;
              auVar198._8_4_ = fVar181;
              auVar198._12_4_ = fVar181;
              auVar87 = vfmadd132ps_fma(auVar198,auVar217,local_680._0_16_);
              fVar181 = auVar233._0_4_ * 6.0;
              auVar169._4_4_ = fVar181;
              auVar169._0_4_ = fVar181;
              auVar169._8_4_ = fVar181;
              auVar169._12_4_ = fVar181;
              auVar87 = vfmadd132ps_fma(auVar169,auVar87,local_6a0._0_16_);
              fVar181 = local_580._0_4_ * 6.0;
              auVar199._4_4_ = fVar181;
              auVar199._0_4_ = fVar181;
              auVar199._8_4_ = fVar181;
              auVar199._12_4_ = fVar181;
              auVar87 = vfmadd132ps_fma(auVar199,auVar87,local_660._0_16_);
              auVar170._0_4_ = auVar87._0_4_ * (float)local_5c0._0_4_;
              auVar170._4_4_ = auVar87._4_4_ * (float)local_5c0._0_4_;
              auVar170._8_4_ = auVar87._8_4_ * (float)local_5c0._0_4_;
              auVar170._12_4_ = auVar87._12_4_ * (float)local_5c0._0_4_;
              auVar87 = vdpps_avx(auVar88,auVar87,0x7f);
              fVar181 = auVar87._0_4_;
              auVar200._0_4_ = auVar88._0_4_ * fVar181;
              auVar200._4_4_ = auVar88._4_4_ * fVar181;
              auVar200._8_4_ = auVar88._8_4_ * fVar181;
              auVar200._12_4_ = auVar88._12_4_ * fVar181;
              auVar87 = vsubps_avx(auVar170,auVar200);
              fVar181 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar233 = vmaxss_avx(ZEXT416((uint)fVar148),
                                    ZEXT416((uint)(local_780._0_4_ * fVar175 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar88,auVar30);
              auVar201._0_4_ = auVar87._0_4_ * fVar181 * fVar177;
              auVar201._4_4_ = auVar87._4_4_ * fVar181 * fVar177;
              auVar201._8_4_ = auVar87._8_4_ * fVar181 * fVar177;
              auVar201._12_4_ = auVar87._12_4_ * fVar181 * fVar177;
              auVar87 = vdpps_avx(auVar92,auVar255,0x7f);
              auVar240 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar148),auVar233);
              auVar86 = vdpps_avx(auVar83,auVar201,0x7f);
              vfmadd213ss_avx512f(auVar84,ZEXT416((uint)(fVar148 / fVar149)),auVar240);
              fVar177 = auVar87._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_7f0,auVar255,0x7f);
              auVar87 = vdpps_avx(auVar83,auVar92,0x7f);
              auVar84 = vmulss_avx512f(auVar91,auVar89);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar90 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar84._0_4_ * auVar89._0_4_)));
              auVar89 = vdpps_avx(auVar83,local_7f0,0x7f);
              auVar91 = vfnmadd231ss_avx512f(auVar87,local_820._0_16_,ZEXT416((uint)fVar177));
              auVar89 = vfnmadd231ss_avx512f(auVar89,local_820._0_16_,auVar86);
              auVar87 = vpermilps_avx(local_560._0_16_,0xff);
              fVar179 = fVar179 - auVar87._0_4_;
              auVar84 = vshufps_avx(auVar88,auVar88,0xff);
              auVar87 = vfmsub213ss_fma(auVar91,auVar90,auVar84);
              auVar246._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar89 = ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_));
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                        ZEXT416((uint)fVar177),auVar89);
              auVar87 = vinsertps_avx(auVar246,auVar89,0x1c);
              auVar237._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar237._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar89 = vinsertps_avx(ZEXT416((uint)fVar177),auVar237,0x10);
              auVar218._0_4_ = auVar90._0_4_;
              auVar218._4_4_ = auVar218._0_4_;
              auVar218._8_4_ = auVar218._0_4_;
              auVar218._12_4_ = auVar218._0_4_;
              auVar86 = vdivps_avx(auVar87,auVar218);
              auVar87 = vdivps_avx(auVar89,auVar218);
              auVar89 = vbroadcastss_avx512vl(local_820._0_16_);
              auVar219._0_4_ = auVar89._0_4_ * auVar86._0_4_ + fVar179 * auVar87._0_4_;
              auVar219._4_4_ = auVar89._4_4_ * auVar86._4_4_ + fVar179 * auVar87._4_4_;
              auVar219._8_4_ = auVar89._8_4_ * auVar86._8_4_ + fVar179 * auVar87._8_4_;
              auVar219._12_4_ = auVar89._12_4_ * auVar86._12_4_ + fVar179 * auVar87._12_4_;
              auVar86 = vsubps_avx(local_780._0_16_,auVar219);
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(local_820._0_16_,auVar31);
              auVar87 = vucomiss_avx512f(auVar87);
              if (!(bool)uVar80 && !(bool)uVar81) {
                auVar87 = vaddss_avx512f(auVar233,auVar87);
                auVar87 = vfmadd231ss_fma(auVar87,local_730,ZEXT416(0x36000000));
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx512vl(ZEXT416((uint)fVar179),auVar32);
                if (auVar89._0_4_ < auVar87._0_4_) {
                  fVar175 = auVar86._0_4_ + (float)local_740._0_4_;
                  if ((fVar175 < fVar209) ||
                     (fVar177 = *(float *)(ray + k * 4 + 0x100), fVar177 < fVar175)) break;
                  auVar87 = vmovshdup_avx(auVar86);
                  fVar179 = auVar87._0_4_;
                  if ((fVar179 < 0.0) || (1.0 < fVar179)) break;
                  auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_860._0_4_));
                  fVar149 = auVar87._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar77].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar149 = fVar149 * 1.5 +
                            (float)local_860._0_4_ * -0.5 * fVar149 * fVar149 * fVar149;
                  auVar220._0_4_ = auVar83._0_4_ * fVar149;
                  auVar220._4_4_ = auVar83._4_4_ * fVar149;
                  auVar220._8_4_ = auVar83._8_4_ * fVar149;
                  auVar220._12_4_ = auVar83._12_4_ * fVar149;
                  auVar89 = vfmadd213ps_fma(auVar84,auVar220,auVar88);
                  auVar87 = vshufps_avx(auVar220,auVar220,0xc9);
                  auVar83 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar221._0_4_ = auVar220._0_4_ * auVar83._0_4_;
                  auVar221._4_4_ = auVar220._4_4_ * auVar83._4_4_;
                  auVar221._8_4_ = auVar220._8_4_ * auVar83._8_4_;
                  auVar221._12_4_ = auVar220._12_4_ * auVar83._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar221,auVar88,auVar87);
                  auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                  auVar156._0_4_ = auVar89._0_4_ * auVar88._0_4_;
                  auVar156._4_4_ = auVar89._4_4_ * auVar88._4_4_;
                  auVar156._8_4_ = auVar89._8_4_ * auVar88._8_4_;
                  auVar156._12_4_ = auVar89._12_4_ * auVar88._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar156,auVar87,auVar83);
                  uVar163 = auVar87._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar175;
                    uVar7 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar7;
                    uVar7 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar163;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar179;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar6;
                    *(uint *)(ray + k * 4 + 0x240) = uVar77;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar10 = context->user;
                  auVar224._8_4_ = 1;
                  auVar224._0_8_ = 0x100000001;
                  auVar224._12_4_ = 1;
                  auVar224._16_4_ = 1;
                  auVar224._20_4_ = 1;
                  auVar224._24_4_ = 1;
                  auVar224._28_4_ = 1;
                  local_3c0 = vpermps_avx2(auVar224,ZEXT1632(auVar86));
                  auVar104 = vpermps_avx2(auVar224,ZEXT1632(auVar87));
                  auVar231._8_4_ = 2;
                  auVar231._0_8_ = 0x200000002;
                  auVar231._12_4_ = 2;
                  auVar231._16_4_ = 2;
                  auVar231._20_4_ = 2;
                  auVar231._24_4_ = 2;
                  auVar231._28_4_ = 2;
                  local_400 = vpermps_avx2(auVar231,ZEXT1632(auVar87));
                  local_420[0] = (RTCHitN)auVar104[0];
                  local_420[1] = (RTCHitN)auVar104[1];
                  local_420[2] = (RTCHitN)auVar104[2];
                  local_420[3] = (RTCHitN)auVar104[3];
                  local_420[4] = (RTCHitN)auVar104[4];
                  local_420[5] = (RTCHitN)auVar104[5];
                  local_420[6] = (RTCHitN)auVar104[6];
                  local_420[7] = (RTCHitN)auVar104[7];
                  local_420[8] = (RTCHitN)auVar104[8];
                  local_420[9] = (RTCHitN)auVar104[9];
                  local_420[10] = (RTCHitN)auVar104[10];
                  local_420[0xb] = (RTCHitN)auVar104[0xb];
                  local_420[0xc] = (RTCHitN)auVar104[0xc];
                  local_420[0xd] = (RTCHitN)auVar104[0xd];
                  local_420[0xe] = (RTCHitN)auVar104[0xe];
                  local_420[0xf] = (RTCHitN)auVar104[0xf];
                  local_420[0x10] = (RTCHitN)auVar104[0x10];
                  local_420[0x11] = (RTCHitN)auVar104[0x11];
                  local_420[0x12] = (RTCHitN)auVar104[0x12];
                  local_420[0x13] = (RTCHitN)auVar104[0x13];
                  local_420[0x14] = (RTCHitN)auVar104[0x14];
                  local_420[0x15] = (RTCHitN)auVar104[0x15];
                  local_420[0x16] = (RTCHitN)auVar104[0x16];
                  local_420[0x17] = (RTCHitN)auVar104[0x17];
                  local_420[0x18] = (RTCHitN)auVar104[0x18];
                  local_420[0x19] = (RTCHitN)auVar104[0x19];
                  local_420[0x1a] = (RTCHitN)auVar104[0x1a];
                  local_420[0x1b] = (RTCHitN)auVar104[0x1b];
                  local_420[0x1c] = (RTCHitN)auVar104[0x1c];
                  local_420[0x1d] = (RTCHitN)auVar104[0x1d];
                  local_420[0x1e] = (RTCHitN)auVar104[0x1e];
                  local_420[0x1f] = (RTCHitN)auVar104[0x1f];
                  local_3e0 = uVar163;
                  uStack_3dc = uVar163;
                  uStack_3d8 = uVar163;
                  uStack_3d4 = uVar163;
                  uStack_3d0 = uVar163;
                  uStack_3cc = uVar163;
                  uStack_3c8 = uVar163;
                  uStack_3c4 = uVar163;
                  local_3a0 = ZEXT432(0) << 0x20;
                  local_380 = local_460._0_8_;
                  uStack_378 = local_460._8_8_;
                  uStack_370 = local_460._16_8_;
                  uStack_368 = local_460._24_8_;
                  local_360 = local_440;
                  auVar104 = vpcmpeqd_avx2(local_440,local_440);
                  local_828[1] = auVar104;
                  *local_828 = auVar104;
                  local_340 = pRVar10->instID[0];
                  uStack_33c = local_340;
                  uStack_338 = local_340;
                  uStack_334 = local_340;
                  uStack_330 = local_340;
                  uStack_32c = local_340;
                  uStack_328 = local_340;
                  uStack_324 = local_340;
                  local_320 = pRVar10->instPrimID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  *(float *)(ray + k * 4 + 0x100) = fVar175;
                  local_760 = local_4a0;
                  local_930.valid = (int *)local_760;
                  local_930.geometryUserPtr = pGVar8->userPtr;
                  local_930.context = context->user;
                  local_930.hit = local_420;
                  local_930.N = 8;
                  local_930.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_930);
                    auVar259 = ZEXT3264(local_900);
                    auVar258 = ZEXT3264(local_8e0);
                    auVar257 = ZEXT3264(local_8c0);
                    auVar256 = ZEXT3264(local_8a0);
                    auVar254 = ZEXT3264(local_880);
                  }
                  if (local_760 != (undefined1  [32])0x0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_930);
                      auVar259 = ZEXT3264(local_900);
                      auVar258 = ZEXT3264(local_8e0);
                      auVar257 = ZEXT3264(local_8c0);
                      auVar256 = ZEXT3264(local_8a0);
                      auVar254 = ZEXT3264(local_880);
                    }
                    if (local_760 != (undefined1  [32])0x0) {
                      uVar76 = vptestmd_avx512vl(local_760,local_760);
                      iVar3 = *(int *)(local_930.hit + 4);
                      iVar4 = *(int *)(local_930.hit + 8);
                      iVar1 = *(int *)(local_930.hit + 0xc);
                      iVar59 = *(int *)(local_930.hit + 0x10);
                      iVar60 = *(int *)(local_930.hit + 0x14);
                      iVar61 = *(int *)(local_930.hit + 0x18);
                      iVar62 = *(int *)(local_930.hit + 0x1c);
                      bVar79 = (byte)uVar76;
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x180) =
                           (uint)(bVar79 & 1) * *(int *)local_930.hit |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x180);
                      *(uint *)(local_930.ray + 0x184) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x184);
                      *(uint *)(local_930.ray + 0x188) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x188);
                      *(uint *)(local_930.ray + 0x18c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x18c);
                      *(uint *)(local_930.ray + 400) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 400);
                      *(uint *)(local_930.ray + 0x194) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x194);
                      *(uint *)(local_930.ray + 0x198) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x198);
                      *(uint *)(local_930.ray + 0x19c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x19c);
                      iVar3 = *(int *)(local_930.hit + 0x24);
                      iVar4 = *(int *)(local_930.hit + 0x28);
                      iVar1 = *(int *)(local_930.hit + 0x2c);
                      iVar59 = *(int *)(local_930.hit + 0x30);
                      iVar60 = *(int *)(local_930.hit + 0x34);
                      iVar61 = *(int *)(local_930.hit + 0x38);
                      iVar62 = *(int *)(local_930.hit + 0x3c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x1a0) =
                           (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x20) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x1a0);
                      *(uint *)(local_930.ray + 0x1a4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x1a4);
                      *(uint *)(local_930.ray + 0x1a8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x1a8);
                      *(uint *)(local_930.ray + 0x1ac) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x1ac);
                      *(uint *)(local_930.ray + 0x1b0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x1b0);
                      *(uint *)(local_930.ray + 0x1b4) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x1b4);
                      *(uint *)(local_930.ray + 0x1b8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x1b8);
                      *(uint *)(local_930.ray + 0x1bc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x1bc);
                      iVar3 = *(int *)(local_930.hit + 0x44);
                      iVar4 = *(int *)(local_930.hit + 0x48);
                      iVar1 = *(int *)(local_930.hit + 0x4c);
                      iVar59 = *(int *)(local_930.hit + 0x50);
                      iVar60 = *(int *)(local_930.hit + 0x54);
                      iVar61 = *(int *)(local_930.hit + 0x58);
                      iVar62 = *(int *)(local_930.hit + 0x5c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x1c0) =
                           (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x40) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x1c0);
                      *(uint *)(local_930.ray + 0x1c4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x1c4);
                      *(uint *)(local_930.ray + 0x1c8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x1c8);
                      *(uint *)(local_930.ray + 0x1cc) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x1cc);
                      *(uint *)(local_930.ray + 0x1d0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x1d0);
                      *(uint *)(local_930.ray + 0x1d4) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x1d4);
                      *(uint *)(local_930.ray + 0x1d8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x1d8);
                      *(uint *)(local_930.ray + 0x1dc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x1dc);
                      iVar3 = *(int *)(local_930.hit + 100);
                      iVar4 = *(int *)(local_930.hit + 0x68);
                      iVar1 = *(int *)(local_930.hit + 0x6c);
                      iVar59 = *(int *)(local_930.hit + 0x70);
                      iVar60 = *(int *)(local_930.hit + 0x74);
                      iVar61 = *(int *)(local_930.hit + 0x78);
                      iVar62 = *(int *)(local_930.hit + 0x7c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x1e0) =
                           (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x60) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x1e0);
                      *(uint *)(local_930.ray + 0x1e4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x1e4);
                      *(uint *)(local_930.ray + 0x1e8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x1e8);
                      *(uint *)(local_930.ray + 0x1ec) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x1ec);
                      *(uint *)(local_930.ray + 0x1f0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x1f0);
                      *(uint *)(local_930.ray + 500) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 500);
                      *(uint *)(local_930.ray + 0x1f8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x1f8);
                      *(uint *)(local_930.ray + 0x1fc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x1fc);
                      iVar3 = *(int *)(local_930.hit + 0x84);
                      iVar4 = *(int *)(local_930.hit + 0x88);
                      iVar1 = *(int *)(local_930.hit + 0x8c);
                      iVar59 = *(int *)(local_930.hit + 0x90);
                      iVar60 = *(int *)(local_930.hit + 0x94);
                      iVar61 = *(int *)(local_930.hit + 0x98);
                      iVar62 = *(int *)(local_930.hit + 0x9c);
                      bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar76 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                      bVar17 = SUB81(uVar76 >> 7,0);
                      *(uint *)(local_930.ray + 0x200) =
                           (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x80) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x200);
                      *(uint *)(local_930.ray + 0x204) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_930.ray + 0x204);
                      *(uint *)(local_930.ray + 0x208) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_930.ray + 0x208);
                      *(uint *)(local_930.ray + 0x20c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_930.ray + 0x20c);
                      *(uint *)(local_930.ray + 0x210) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_930.ray + 0x210);
                      *(uint *)(local_930.ray + 0x214) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_930.ray + 0x214);
                      *(uint *)(local_930.ray + 0x218) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_930.ray + 0x218);
                      *(uint *)(local_930.ray + 0x21c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_930.ray + 0x21c);
                      auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0xa0));
                      *(undefined1 (*) [32])(local_930.ray + 0x220) = auVar104;
                      auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0xc0));
                      *(undefined1 (*) [32])(local_930.ray + 0x240) = auVar104;
                      auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0xe0));
                      *(undefined1 (*) [32])(local_930.ray + 0x260) = auVar104;
                      auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_930.hit + 0x100));
                      *(undefined1 (*) [32])(local_930.ray + 0x280) = auVar104;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar177;
                  break;
                }
              }
              lVar78 = lVar78 + -1;
            } while (lVar78 != 0);
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar160._4_4_ = uVar163;
            auVar160._0_4_ = uVar163;
            auVar160._8_4_ = uVar163;
            auVar160._12_4_ = uVar163;
            auVar160._16_4_ = uVar163;
            auVar160._20_4_ = uVar163;
            auVar160._24_4_ = uVar163;
            auVar160._28_4_ = uVar163;
            auVar64._4_4_ = fStack_4dc;
            auVar64._0_4_ = local_4e0;
            auVar64._8_4_ = fStack_4d8;
            auVar64._12_4_ = fStack_4d4;
            auVar64._16_4_ = fStack_4d0;
            auVar64._20_4_ = fStack_4cc;
            auVar64._24_4_ = fStack_4c8;
            auVar64._28_4_ = fStack_4c4;
            uVar20 = vcmpps_avx512vl(auVar160,auVar64,0xd);
            bVar69 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar69 & (byte)uVar20;
          } while (bVar69 != 0);
          auVar138 = local_500;
          fVar148 = (float)local_7c0._0_4_;
          fVar175 = (float)local_7c0._4_4_;
          fVar177 = fStack_7b8;
          fVar179 = fStack_7b4;
          fVar149 = fStack_7b0;
          fVar181 = fStack_7ac;
          fVar183 = fStack_7a8;
          fVar208 = fStack_7a4;
        }
        auVar232 = ZEXT3264(local_7e0);
        uVar21 = vpcmpgtd_avx512vl(auVar138,local_480);
        uVar22 = vpcmpd_avx512vl(local_480,local_2a0,1);
        auVar206._0_4_ = fVar148 + (float)local_200._0_4_;
        auVar206._4_4_ = fVar175 + (float)local_200._4_4_;
        auVar206._8_4_ = fVar177 + fStack_1f8;
        auVar206._12_4_ = fVar179 + fStack_1f4;
        auVar206._16_4_ = fVar149 + fStack_1f0;
        auVar206._20_4_ = fVar181 + fStack_1ec;
        auVar206._24_4_ = fVar183 + fStack_1e8;
        auVar206._28_4_ = fVar208 + fStack_1e4;
        uVar20 = vcmpps_avx512vl(auVar206,auVar160,2);
        bVar73 = bVar73 & (byte)uVar22 & (byte)uVar20;
        auVar207._0_4_ = fVar148 + local_300._0_4_;
        auVar207._4_4_ = fVar175 + local_300._4_4_;
        auVar207._8_4_ = fVar177 + local_300._8_4_;
        auVar207._12_4_ = fVar179 + local_300._12_4_;
        auVar207._16_4_ = fVar149 + local_300._16_4_;
        auVar207._20_4_ = fVar181 + local_300._20_4_;
        auVar207._24_4_ = fVar183 + local_300._24_4_;
        auVar207._28_4_ = fVar208 + local_300._28_4_;
        uVar20 = vcmpps_avx512vl(auVar207,auVar160,2);
        bVar67 = bVar67 & (byte)uVar21 & (byte)uVar20 | bVar73;
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar104);
        auVar244 = ZEXT3264(local_640);
        prim = local_6f0;
        if (bVar67 != 0) {
          abStack_180[uVar74 * 0x60] = bVar67;
          auVar140._0_4_ =
               (uint)(bVar73 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar73 & 1) * (int)local_300._0_4_;
          bVar11 = (bool)(bVar73 >> 1 & 1);
          auVar140._4_4_ = (uint)bVar11 * local_200._4_4_ | (uint)!bVar11 * (int)local_300._4_4_;
          bVar11 = (bool)(bVar73 >> 2 & 1);
          auVar140._8_4_ = (uint)bVar11 * (int)fStack_1f8 | (uint)!bVar11 * (int)local_300._8_4_;
          bVar11 = (bool)(bVar73 >> 3 & 1);
          auVar140._12_4_ = (uint)bVar11 * (int)fStack_1f4 | (uint)!bVar11 * (int)local_300._12_4_;
          bVar11 = (bool)(bVar73 >> 4 & 1);
          auVar140._16_4_ = (uint)bVar11 * (int)fStack_1f0 | (uint)!bVar11 * (int)local_300._16_4_;
          bVar11 = (bool)(bVar73 >> 5 & 1);
          auVar140._20_4_ = (uint)bVar11 * (int)fStack_1ec | (uint)!bVar11 * (int)local_300._20_4_;
          auVar140._24_4_ =
               (uint)(bVar73 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar73 >> 6) * (int)local_300._24_4_;
          auVar140._28_4_ = local_300._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar74 * 0x60) = auVar140;
          uVar76 = vmovlps_avx(local_4b0);
          (&uStack_140)[uVar74 * 0xc] = uVar76;
          aiStack_138[uVar74 * 0x18] = iVar75 + 1;
          uVar74 = (ulong)((int)uVar74 + 1);
        }
      }
    }
    do {
      uVar82 = (uint)uVar74;
      uVar74 = (ulong)(uVar82 - 1);
      if (uVar82 == 0) {
        uVar163 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar38._4_4_ = uVar163;
        auVar38._0_4_ = uVar163;
        auVar38._8_4_ = uVar163;
        auVar38._12_4_ = uVar163;
        auVar38._16_4_ = uVar163;
        auVar38._20_4_ = uVar163;
        auVar38._24_4_ = uVar163;
        auVar38._28_4_ = uVar163;
        uVar20 = vcmpps_avx512vl(local_280,auVar38,2);
        uVar77 = (uint)local_6e8 & (uint)uVar20;
        local_6e8 = (ulong)uVar77;
        if (uVar77 == 0) {
          return;
        }
        goto LAB_01d4abbf;
      }
      lVar78 = uVar74 * 0x60;
      auVar104 = *(undefined1 (*) [32])(auStack_160 + lVar78);
      auVar171._0_4_ = fVar148 + auVar104._0_4_;
      auVar171._4_4_ = fVar175 + auVar104._4_4_;
      auVar171._8_4_ = fVar177 + auVar104._8_4_;
      auVar171._12_4_ = fVar179 + auVar104._12_4_;
      auVar171._16_4_ = fVar149 + auVar104._16_4_;
      auVar171._20_4_ = fVar181 + auVar104._20_4_;
      auVar171._24_4_ = fVar183 + auVar104._24_4_;
      auVar171._28_4_ = fVar208 + auVar104._28_4_;
      uVar163 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37._4_4_ = uVar163;
      auVar37._0_4_ = uVar163;
      auVar37._8_4_ = uVar163;
      auVar37._12_4_ = uVar163;
      auVar37._16_4_ = uVar163;
      auVar37._20_4_ = uVar163;
      auVar37._24_4_ = uVar163;
      auVar37._28_4_ = uVar163;
      uVar20 = vcmpps_avx512vl(auVar171,auVar37,2);
      uVar71 = (uint)uVar20 & (uint)abStack_180[lVar78];
    } while (uVar71 == 0);
    uVar76 = (&uStack_140)[uVar74 * 0xc];
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar76;
    auVar204._8_4_ = 0x7f800000;
    auVar204._0_8_ = 0x7f8000007f800000;
    auVar204._12_4_ = 0x7f800000;
    auVar204._16_4_ = 0x7f800000;
    auVar204._20_4_ = 0x7f800000;
    auVar204._24_4_ = 0x7f800000;
    auVar204._28_4_ = 0x7f800000;
    auVar105 = vblendmps_avx512vl(auVar204,auVar104);
    bVar67 = (byte)uVar71;
    auVar136._0_4_ =
         (uint)(bVar67 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar104._0_4_;
    bVar11 = (bool)((byte)(uVar71 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar11 * auVar105._4_4_ | (uint)!bVar11 * (int)auVar104._4_4_;
    bVar11 = (bool)((byte)(uVar71 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar11 * auVar105._8_4_ | (uint)!bVar11 * (int)auVar104._8_4_;
    bVar11 = (bool)((byte)(uVar71 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar11 * auVar105._12_4_ | (uint)!bVar11 * (int)auVar104._12_4_;
    bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar11 * auVar105._16_4_ | (uint)!bVar11 * (int)auVar104._16_4_;
    bVar11 = (bool)((byte)(uVar71 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar11 * auVar105._20_4_ | (uint)!bVar11 * (int)auVar104._20_4_;
    bVar11 = (bool)((byte)(uVar71 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar11 * auVar105._24_4_ | (uint)!bVar11 * (int)auVar104._24_4_;
    auVar136._28_4_ =
         (uVar71 >> 7) * auVar105._28_4_ | (uint)!SUB41(uVar71 >> 7,0) * (int)auVar104._28_4_;
    auVar104 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar104 = vminps_avx(auVar136,auVar104);
    auVar105 = vshufpd_avx(auVar104,auVar104,5);
    auVar104 = vminps_avx(auVar104,auVar105);
    auVar105 = vpermpd_avx2(auVar104,0x4e);
    auVar104 = vminps_avx(auVar104,auVar105);
    uVar20 = vcmpps_avx512vl(auVar136,auVar104,0);
    bVar69 = (byte)uVar20 & bVar67;
    if (bVar69 != 0) {
      uVar71 = (uint)bVar69;
    }
    uVar141 = 0;
    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
      uVar141 = uVar141 + 1;
    }
    iVar75 = aiStack_138[uVar74 * 0x18];
    bVar67 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar67;
    abStack_180[lVar78] = bVar67;
    if (bVar67 == 0) {
      uVar82 = uVar82 - 1;
    }
    uVar163 = (undefined4)uVar76;
    auVar157._4_4_ = uVar163;
    auVar157._0_4_ = uVar163;
    auVar157._8_4_ = uVar163;
    auVar157._12_4_ = uVar163;
    auVar157._16_4_ = uVar163;
    auVar157._20_4_ = uVar163;
    auVar157._24_4_ = uVar163;
    auVar157._28_4_ = uVar163;
    auVar86 = vmovshdup_avx(auVar164);
    auVar86 = vsubps_avx(auVar86,auVar164);
    auVar172._0_4_ = auVar86._0_4_;
    auVar172._4_4_ = auVar172._0_4_;
    auVar172._8_4_ = auVar172._0_4_;
    auVar172._12_4_ = auVar172._0_4_;
    auVar172._16_4_ = auVar172._0_4_;
    auVar172._20_4_ = auVar172._0_4_;
    auVar172._24_4_ = auVar172._0_4_;
    auVar172._28_4_ = auVar172._0_4_;
    auVar86 = vfmadd132ps_fma(auVar172,auVar157,_DAT_01faff20);
    auVar104 = ZEXT1632(auVar86);
    local_420[0] = (RTCHitN)auVar104[0];
    local_420[1] = (RTCHitN)auVar104[1];
    local_420[2] = (RTCHitN)auVar104[2];
    local_420[3] = (RTCHitN)auVar104[3];
    local_420[4] = (RTCHitN)auVar104[4];
    local_420[5] = (RTCHitN)auVar104[5];
    local_420[6] = (RTCHitN)auVar104[6];
    local_420[7] = (RTCHitN)auVar104[7];
    local_420[8] = (RTCHitN)auVar104[8];
    local_420[9] = (RTCHitN)auVar104[9];
    local_420[10] = (RTCHitN)auVar104[10];
    local_420[0xb] = (RTCHitN)auVar104[0xb];
    local_420[0xc] = (RTCHitN)auVar104[0xc];
    local_420[0xd] = (RTCHitN)auVar104[0xd];
    local_420[0xe] = (RTCHitN)auVar104[0xe];
    local_420[0xf] = (RTCHitN)auVar104[0xf];
    local_420[0x10] = (RTCHitN)auVar104[0x10];
    local_420[0x11] = (RTCHitN)auVar104[0x11];
    local_420[0x12] = (RTCHitN)auVar104[0x12];
    local_420[0x13] = (RTCHitN)auVar104[0x13];
    local_420[0x14] = (RTCHitN)auVar104[0x14];
    local_420[0x15] = (RTCHitN)auVar104[0x15];
    local_420[0x16] = (RTCHitN)auVar104[0x16];
    local_420[0x17] = (RTCHitN)auVar104[0x17];
    local_420[0x18] = (RTCHitN)auVar104[0x18];
    local_420[0x19] = (RTCHitN)auVar104[0x19];
    local_420[0x1a] = (RTCHitN)auVar104[0x1a];
    local_420[0x1b] = (RTCHitN)auVar104[0x1b];
    local_420[0x1c] = (RTCHitN)auVar104[0x1c];
    local_420[0x1d] = (RTCHitN)auVar104[0x1d];
    local_420[0x1e] = (RTCHitN)auVar104[0x1e];
    local_420[0x1f] = (RTCHitN)auVar104[0x1f];
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_420 + (ulong)uVar141 * 4);
    uVar74 = (ulong)uVar82;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }